

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_add_golas_heart.cpp
# Opt level: O3

void __thiscall PatchAddGolasHeart::alter_world(PatchAddGolasHeart *this,World *w)

{
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *pmVar1;
  pointer *ppMVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Color CVar8;
  Color CVar9;
  Color CVar10;
  Color CVar11;
  Color CVar12;
  Color CVar13;
  Color CVar14;
  Color CVar15;
  Color CVar16;
  Color CVar17;
  Color CVar18;
  Color CVar19;
  Color CVar20;
  Color CVar21;
  Color CVar22;
  Color CVar23;
  Color CVar24;
  Color CVar25;
  Color CVar26;
  Color CVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  PatchAddGolasHeart *pPVar29;
  vector<MapConnection,_std::allocator<MapConnection>_> *this_00;
  RandomizerWorld *pRVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined2 uVar33;
  undefined2 uVar34;
  uint uVar35;
  MapPalette *palette;
  mapped_type *ppMVar36;
  MapPalette *pMVar37;
  MapPalette *pMVar38;
  Entity *pEVar39;
  pointer pcVar40;
  Map *pMVar41;
  iterator iVar42;
  uint8_t i;
  long lVar43;
  size_type __dnew;
  size_type __dnew_1;
  Attributes local_2f8;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *local_2a8;
  PatchAddGolasHeart *local_2a0;
  vector<MapConnection,_std::allocator<MapConnection>_> *local_298;
  RandomizerWorld *local_290;
  undefined1 local_288 [12];
  bool bStack_27c;
  undefined2 uStack_27b;
  bool bStack_279;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_278;
  pointer pEStack_268;
  pointer local_260;
  pointer pEStack_258;
  undefined **local_250;
  uint16_t local_248;
  uint8_t local_246;
  undefined2 local_240;
  bool local_23e;
  undefined1 local_238 [12];
  undefined4 uStack_22c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_228;
  pointer pEStack_218;
  pointer local_210;
  pointer pEStack_208;
  undefined **local_200;
  uint16_t local_1f8;
  uint8_t local_1f6;
  undefined2 local_1f0;
  bool local_1ee;
  Attributes local_1e0;
  MapPalette *local_190;
  Attributes local_188;
  Attributes local_138;
  MapPalette *local_e0;
  MapPalette *local_d8;
  Attributes local_d0;
  Attributes local_80;
  
  local_2a0 = this;
  palette = (MapPalette *)operator_new(0x34);
  local_2f8.type_id = '1';
  local_2f8.position.x = '\x01';
  pmVar1 = &w->_maps;
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar37 = (*ppMVar36)->_palette;
  (palette->super_array<Color,_13UL>)._M_elems[0xc] =
       (pMVar37->super_array<Color,_13UL>)._M_elems[0xc];
  uVar3 = *(undefined8 *)(pMVar37->super_array<Color,_13UL>)._M_elems;
  uVar4 = *(undefined8 *)((pMVar37->super_array<Color,_13UL>)._M_elems + 2);
  uVar5 = *(undefined8 *)((pMVar37->super_array<Color,_13UL>)._M_elems + 4);
  uVar6 = *(undefined8 *)((pMVar37->super_array<Color,_13UL>)._M_elems + 6);
  uVar7 = *(undefined8 *)((pMVar37->super_array<Color,_13UL>)._M_elems + 10);
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 8) =
       *(undefined8 *)((pMVar37->super_array<Color,_13UL>)._M_elems + 8);
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 10) = uVar7;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 4) = uVar5;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 6) = uVar6;
  *(undefined8 *)(palette->super_array<Color,_13UL>)._M_elems = uVar3;
  *(undefined8 *)((palette->super_array<Color,_13UL>)._M_elems + 2) = uVar4;
  Color::Color((Color *)&local_2f8,0x80,' ',' ');
  CVar8._b = local_2f8.position.y;
  CVar8._invalid = (bool)local_2f8.position.z;
  CVar8._r = local_2f8.type_id;
  CVar8._g = local_2f8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[1] = CVar8;
  Color::Color((Color *)&local_2f8,0xa0,'@',' ');
  CVar9._b = local_2f8.position.y;
  CVar9._invalid = (bool)local_2f8.position.z;
  CVar9._r = local_2f8.type_id;
  CVar9._g = local_2f8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[2] = CVar9;
  Color::Color((Color *)&local_2f8,0xc0,'`','@');
  CVar10._b = local_2f8.position.y;
  CVar10._invalid = (bool)local_2f8.position.z;
  CVar10._r = local_2f8.type_id;
  CVar10._g = local_2f8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[3] = CVar10;
  Color::Color((Color *)&local_2f8,'`',' ',' ');
  CVar11._b = local_2f8.position.y;
  CVar11._invalid = (bool)local_2f8.position.z;
  CVar11._r = local_2f8.type_id;
  CVar11._g = local_2f8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[5] = CVar11;
  Color::Color((Color *)&local_2f8,'`','@','@');
  CVar12._b = local_2f8.position.y;
  CVar12._invalid = (bool)local_2f8.position.z;
  CVar12._r = local_2f8.type_id;
  CVar12._g = local_2f8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[6] = CVar12;
  Color::Color((Color *)&local_2f8,0xa0,'`','`');
  CVar13._b = local_2f8.position.y;
  CVar13._invalid = (bool)local_2f8.position.z;
  CVar13._r = local_2f8.type_id;
  CVar13._g = local_2f8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[7] = CVar13;
  Color::Color((Color *)&local_2f8,0xa0,'`',' ');
  CVar14._b = local_2f8.position.y;
  CVar14._invalid = (bool)local_2f8.position.z;
  CVar14._r = local_2f8.type_id;
  CVar14._g = local_2f8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[8] = CVar14;
  lVar43 = 0;
  Color::Color((Color *)&local_2f8,0x80,'\0','\0');
  CVar15._b = local_2f8.position.y;
  CVar15._invalid = (bool)local_2f8.position.z;
  CVar15._r = local_2f8.type_id;
  CVar15._g = local_2f8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[9] = CVar15;
  Color::Color((Color *)&local_2f8,0xe0,'@','@');
  CVar16._b = local_2f8.position.y;
  CVar16._invalid = (bool)local_2f8.position.z;
  CVar16._r = local_2f8.type_id;
  CVar16._g = local_2f8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[10] = CVar16;
  Color::Color((Color *)&local_2f8,0xe0,0x80,0x80);
  CVar17._b = local_2f8.position.y;
  CVar17._invalid = (bool)local_2f8.position.z;
  CVar17._r = local_2f8.type_id;
  CVar17._g = local_2f8.position.x;
  (palette->super_array<Color,_13UL>)._M_elems[0xb] = CVar17;
  World::add_map_palette(w,palette);
  local_2f8.type_id = 'V';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  local_290 = (RandomizerWorld *)w;
  pMVar37 = build_greyscale_palette(w,(*ppMVar36)->_palette,1.0);
  local_d8 = (MapPalette *)operator_new(0x34);
  (local_d8->super_array<Color,_13UL>)._M_elems[0]._r = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[0]._g = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[0]._b = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[0]._invalid = false;
  (local_d8->super_array<Color,_13UL>)._M_elems[1]._r = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[1]._g = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[1]._b = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[1]._invalid = false;
  (local_d8->super_array<Color,_13UL>)._M_elems[2]._r = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[2]._g = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[2]._b = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[2]._invalid = false;
  (local_d8->super_array<Color,_13UL>)._M_elems[3]._r = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[3]._g = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[3]._b = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[3]._invalid = false;
  (local_d8->super_array<Color,_13UL>)._M_elems[4]._r = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[4]._g = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[4]._b = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[4]._invalid = false;
  (local_d8->super_array<Color,_13UL>)._M_elems[5]._r = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[5]._g = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[5]._b = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[5]._invalid = false;
  (local_d8->super_array<Color,_13UL>)._M_elems[6]._r = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[6]._g = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[6]._b = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[6]._invalid = false;
  (local_d8->super_array<Color,_13UL>)._M_elems[7]._r = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[7]._g = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[7]._b = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[7]._invalid = false;
  (local_d8->super_array<Color,_13UL>)._M_elems[8]._r = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[8]._g = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[8]._b = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[8]._invalid = false;
  (local_d8->super_array<Color,_13UL>)._M_elems[9]._r = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[9]._g = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[9]._b = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[9]._invalid = false;
  (local_d8->super_array<Color,_13UL>)._M_elems[10]._r = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[10]._g = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[10]._b = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[10]._invalid = false;
  (local_d8->super_array<Color,_13UL>)._M_elems[0xb]._r = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[0xb]._g = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[0xb]._b = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[0xb]._invalid = false;
  (local_d8->super_array<Color,_13UL>)._M_elems[0xc]._r = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[0xc]._g = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[0xc]._b = '\0';
  (local_d8->super_array<Color,_13UL>)._M_elems[0xc]._invalid = false;
  do {
    *(undefined4 *)(&(local_d8->super_array<Color,_13UL>)._M_elems[0]._r + lVar43) = 0x1000000;
    lVar43 = lVar43 + 4;
  } while (lVar43 != 0x34);
  lVar43 = 0;
  local_2a8 = pmVar1;
  do {
    uVar35 = (uint)(pMVar37->super_array<Color,_13UL>)._M_elems[lVar43]._b;
    Color::Color((Color *)&local_2f8,
                 (uint8_t)((uint)(pMVar37->super_array<Color,_13UL>)._M_elems[lVar43]._r +
                           (uint)(palette->super_array<Color,_13UL>)._M_elems[lVar43]._r >> 1),
                 (uint8_t)((palette->super_array<Color,_13UL>)._M_elems[lVar43]._g + uVar35 >> 1),
                 (uint8_t)((palette->super_array<Color,_13UL>)._M_elems[lVar43]._b + uVar35 >> 1));
    pRVar30 = local_290;
    CVar18._b = local_2f8.position.y;
    CVar18._invalid = (bool)local_2f8.position.z;
    CVar18._r = local_2f8.type_id;
    CVar18._g = local_2f8.position.x;
    (local_d8->super_array<Color,_13UL>)._M_elems[lVar43] = CVar18;
    lVar43 = lVar43 + 1;
  } while (lVar43 != 0xd);
  local_190 = pMVar37;
  World::add_map_palette(&local_290->super_World,local_d8);
  pmVar1 = local_2a8;
  local_2f8.type_id = 'o';
  local_2f8.position.x = '\0';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(local_2a8,(key_type *)&local_2f8);
  local_e0 = build_greyscale_palette(&pRVar30->super_World,(*ppMVar36)->_palette,0.4);
  local_2f8.type_id = '9';
  local_2f8.position.x = '\0';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41 = *ppMVar36;
  local_2f8.type_id = '\f';
  local_2f8.position.x = '\x02';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_layout = (*ppMVar36)->_layout;
  local_2f8.type_id = '\f';
  local_2f8.position.x = '\x02';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_blockset = (*ppMVar36)->_blockset;
  pMVar38 = (MapPalette *)operator_new(0x34);
  local_2f8.type_id = '\f';
  local_2f8.position.x = '\x02';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar37 = (*ppMVar36)->_palette;
  (pMVar38->super_array<Color,_13UL>)._M_elems[0xc] =
       (pMVar37->super_array<Color,_13UL>)._M_elems[0xc];
  uVar3 = *(undefined8 *)(pMVar37->super_array<Color,_13UL>)._M_elems;
  uVar4 = *(undefined8 *)((pMVar37->super_array<Color,_13UL>)._M_elems + 2);
  uVar5 = *(undefined8 *)((pMVar37->super_array<Color,_13UL>)._M_elems + 4);
  uVar6 = *(undefined8 *)((pMVar37->super_array<Color,_13UL>)._M_elems + 6);
  uVar7 = *(undefined8 *)((pMVar37->super_array<Color,_13UL>)._M_elems + 10);
  *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 8) =
       *(undefined8 *)((pMVar37->super_array<Color,_13UL>)._M_elems + 8);
  *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 10) = uVar7;
  *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 4) = uVar5;
  *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 6) = uVar6;
  *(undefined8 *)(pMVar38->super_array<Color,_13UL>)._M_elems = uVar3;
  *(undefined8 *)((pMVar38->super_array<Color,_13UL>)._M_elems + 2) = uVar4;
  Color::Color((Color *)&local_2f8,0x80,'\0','\0');
  CVar19._b = local_2f8.position.y;
  CVar19._invalid = (bool)local_2f8.position.z;
  CVar19._r = local_2f8.type_id;
  CVar19._g = local_2f8.position.x;
  (pMVar38->super_array<Color,_13UL>)._M_elems[0] = CVar19;
  Color::Color((Color *)&local_2f8,'@','\0',' ');
  CVar20._b = local_2f8.position.y;
  CVar20._invalid = (bool)local_2f8.position.z;
  CVar20._r = local_2f8.type_id;
  CVar20._g = local_2f8.position.x;
  (pMVar38->super_array<Color,_13UL>)._M_elems[3] = CVar20;
  Color::Color((Color *)&local_2f8,0x80,'@','\0');
  CVar21._b = local_2f8.position.y;
  CVar21._invalid = (bool)local_2f8.position.z;
  CVar21._r = local_2f8.type_id;
  CVar21._g = local_2f8.position.x;
  (pMVar38->super_array<Color,_13UL>)._M_elems[4] = CVar21;
  Color::Color((Color *)&local_2f8,0xc0,'@','\0');
  CVar22._b = local_2f8.position.y;
  CVar22._invalid = (bool)local_2f8.position.z;
  CVar22._r = local_2f8.type_id;
  CVar22._g = local_2f8.position.x;
  (pMVar38->super_array<Color,_13UL>)._M_elems[5] = CVar22;
  Color::Color((Color *)&local_2f8,0xe0,'@','@');
  CVar23._b = local_2f8.position.y;
  CVar23._invalid = (bool)local_2f8.position.z;
  CVar23._r = local_2f8.type_id;
  CVar23._g = local_2f8.position.x;
  (pMVar38->super_array<Color,_13UL>)._M_elems[8] = CVar23;
  Color::Color((Color *)&local_2f8,'`','\0','\0');
  CVar24._b = local_2f8.position.y;
  CVar24._invalid = (bool)local_2f8.position.z;
  CVar24._r = local_2f8.type_id;
  CVar24._g = local_2f8.position.x;
  (pMVar38->super_array<Color,_13UL>)._M_elems[9] = CVar24;
  Color::Color((Color *)&local_2f8,0x80,' ',' ');
  CVar25._b = local_2f8.position.y;
  CVar25._invalid = (bool)local_2f8.position.z;
  CVar25._r = local_2f8.type_id;
  CVar25._g = local_2f8.position.x;
  (pMVar38->super_array<Color,_13UL>)._M_elems[10] = CVar25;
  Color::Color((Color *)&local_2f8,0x80,'@','@');
  CVar26._b = local_2f8.position.y;
  CVar26._invalid = (bool)local_2f8.position.z;
  CVar26._r = local_2f8.type_id;
  CVar26._g = local_2f8.position.x;
  (pMVar38->super_array<Color,_13UL>)._M_elems[0xb] = CVar26;
  Color::Color((Color *)&local_2f8,0x80,'`','`');
  CVar27._b = local_2f8.position.y;
  CVar27._invalid = (bool)local_2f8.position.z;
  CVar27._r = local_2f8.type_id;
  CVar27._g = local_2f8.position.x;
  (pMVar38->super_array<Color,_13UL>)._M_elems[0xc] = CVar27;
  World::add_map_palette(&local_290->super_World,pMVar38);
  pMVar41->_palette = pMVar38;
  pMVar41->_background_music = '\x14';
  pEVar39 = (Entity *)operator_new(0x58);
  local_2f8.type_id = 'b';
  local_2f8.position.x = ',';
  local_2f8.position.y = '\x14';
  local_2f8.position.z = '\x06';
  local_2f8.behavior_id = 0;
  local_2f8.position.half_x = false;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\0';
  local_2f8.palette = '\0';
  local_2f8.speed = '\0';
  local_2f8.fightable = false;
  local_2f8.liftable = false;
  local_2f8.can_pass_through = false;
  local_2f8.appear_after_player_moved_away = false;
  local_2f8.gravity_immune = false;
  local_2f8.talkable = false;
  local_2f8.dialogue = '\0';
  local_2f8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_2f8.persistence_flag.byte = 0xff;
  local_2f8.persistence_flag.bit = 0xff;
  local_2f8.flag_unknown_2_3 = false;
  local_2f8.flag_unknown_2_4 = false;
  local_2f8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_2f8);
  Map::add_entity(pMVar41,pEVar39);
  pmVar1 = local_2a8;
  if (local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_238[0] = 'b';
  local_238[1] = '+';
  local_238[2] = '\x16';
  local_238[3] = '\x06';
  aStack_228._M_allocated_capacity._2_2_ = 0;
  local_238[4] = false;
  local_238[5] = false;
  local_238[6] = false;
  local_238[7] = '\0';
  local_238[8] = '\0';
  local_238[9] = '\0';
  local_238[10] = false;
  local_238[0xb] = false;
  uStack_22c._0_1_ = false;
  uStack_22c._1_1_ = false;
  uStack_22c._2_1_ = false;
  uStack_22c._3_1_ = false;
  aStack_228._M_local_buf[0] = '\0';
  aStack_228._8_8_ = (Entity *)0x0;
  pEStack_218 = (pointer)0x0;
  local_210 = (pointer)0x0;
  pEStack_208 = (pointer)0x0;
  local_200 = &PTR_to_json_abi_cxx11__00262898;
  local_1f8 = 0xff;
  local_1f6 = 0xff;
  local_1f0._0_1_ = false;
  local_1f0._1_1_ = false;
  local_1ee = false;
  Entity::Entity(pEVar39,(Attributes *)local_238);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_218 != (pointer)0x0) {
    operator_delete(pEStack_218,(long)pEStack_208 - (long)pEStack_218);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_288[0] = 'b';
  local_288[1] = '+';
  local_288[2] = '\x15';
  local_288[3] = '\b';
  local_288[4] = true;
  aStack_278._M_allocated_capacity._2_2_ = 0;
  local_288[5] = false;
  local_288[6] = false;
  local_288[7] = '\0';
  local_288[8] = '\0';
  local_288[9] = '\0';
  local_288[10] = false;
  local_288[0xb] = false;
  bStack_27c = false;
  uStack_27b._0_1_ = false;
  uStack_27b._1_1_ = false;
  bStack_279 = false;
  aStack_278._M_local_buf[0] = '\0';
  aStack_278._8_8_ = (Entity *)0x0;
  pEStack_268 = (pointer)0x0;
  local_260 = (pointer)0x0;
  pEStack_258 = (pointer)0x0;
  local_250 = &PTR_to_json_abi_cxx11__00262898;
  local_248 = 0xff;
  local_246 = 0xff;
  local_240._0_1_ = false;
  local_240._1_1_ = false;
  local_23e = false;
  Entity::Entity(pEVar39,(Attributes *)local_288);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_268 != (pointer)0x0) {
    operator_delete(pEStack_268,(long)pEStack_258 - (long)pEStack_268);
  }
  local_2a0->_room_1 = pMVar41;
  local_2f8.type_id = ':';
  local_2f8.position.x = '\0';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41 = *ppMVar36;
  local_2f8.type_id = 'R';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_layout = (*ppMVar36)->_layout;
  local_2f8.type_id = 'R';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_blockset = (*ppMVar36)->_blockset;
  pMVar41->_palette = palette;
  pMVar41->_background_music = '\x14';
  pEVar39 = (Entity *)operator_new(0x58);
  local_2f8.type_id = 0x9c;
  local_2f8.position.x = '\x19';
  local_2f8.position.y = '\x1c';
  local_2f8.position.z = '\x02';
  local_2f8.position.half_x = true;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\x02';
  local_2f8.palette = '\x01';
  local_2f8.behavior_id = 0;
  local_2f8.speed = '\0';
  local_2f8.fightable = false;
  local_2f8.liftable = false;
  local_2f8.can_pass_through = false;
  local_2f8.appear_after_player_moved_away = false;
  local_2f8.gravity_immune = false;
  local_2f8.talkable = false;
  local_2f8.dialogue = '\0';
  local_2f8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_2f8.persistence_flag.byte = 0xff;
  local_2f8.persistence_flag.bit = 0xff;
  local_2f8.flag_unknown_2_3 = false;
  local_2f8.flag_unknown_2_4 = false;
  local_2f8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_2f8);
  if (local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Map::add_entity(pMVar41,pEVar39);
  local_238._0_8_ = &aStack_228;
  local_288[0] = 0xce;
  local_288[1] = '\0';
  local_288[2] = '\0';
  local_288[3] = '\0';
  local_288[4] = false;
  local_288[5] = false;
  local_288[6] = false;
  local_288[7] = '\0';
  pcVar40 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238
                      ,(size_type *)local_288,0);
  uVar31 = local_288._0_4_;
  local_238._0_4_ = SUB84(pcVar40,0);
  local_238._4_4_ = (undefined4)((ulong)pcVar40 >> 0x20);
  lVar43 = CONCAT17(local_288[7],
                    CONCAT16(local_288[6],
                             CONCAT15(local_288[5],CONCAT14(local_288[4],local_288._0_4_))));
  aStack_228._M_local_buf[0] = (char)local_288._0_4_;
  aStack_228._M_local_buf[1] = SUB41(local_288._0_4_,1);
  aStack_228._M_allocated_capacity._2_2_ = SUB42(local_288._0_4_,2);
  aStack_228._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar43 >> 0x20);
  uVar32 = aStack_228._M_allocated_capacity._4_4_;
  memcpy(pcVar40,
         "Foxy: At long last, you\'ve come!\nYou are inside Gola\'s heart,\nthe source of all its power.\x1e\nWhat you are about to face in\nhere is incredibly powerful,\nbut I have faith in you.\x1e\nGood luck. You will need it.\x03"
         ,0xce);
  pRVar30 = local_290;
  local_238._8_4_ = uVar31;
  pcVar40[lVar43] = '\0';
  uStack_22c = uVar32;
  RandomizerWorld::add_custom_dialogue_raw(local_290,pEVar39,(string *)local_238);
  pPVar29 = local_2a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_238._4_4_,local_238._0_4_) != &aStack_228) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_238._4_4_,local_238._0_4_),
                    CONCAT44(aStack_228._M_allocated_capacity._4_4_,
                             CONCAT22(aStack_228._M_allocated_capacity._2_2_,
                                      CONCAT11(aStack_228._M_local_buf[1],aStack_228._M_local_buf[0]
                                              ))) + 1);
  }
  pPVar29->_room_2 = pMVar41;
  local_298 = &(pRVar30->super_World)._map_connections;
  local_2f8._0_2_ = pPVar29->_room_1->_id;
  local_2f8._6_2_ = pMVar41->_id;
  local_2f8.position.y = '!';
  local_2f8.position.z = '0';
  local_2f8.position.half_x = true;
  local_2f8.palette = '\x19';
  local_2f8.speed = '\"';
  local_2f8.fightable = false;
  iVar42._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar42._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar42,(MapConnection *)&local_2f8);
  }
  else {
    (iVar42._M_current)->_pos_x_2 = (char)0x2219;
    (iVar42._M_current)->_pos_y_2 = (char)(0x2219 >> 8);
    (iVar42._M_current)->_extra_byte_2 = (char)(0x2219 >> 0x10);
    (iVar42._M_current)->field_0xb = local_2f8.liftable;
    (iVar42._M_current)->_map_id_1 = local_2f8._0_2_;
    (iVar42._M_current)->_pos_x_1 = (char)0x3021;
    (iVar42._M_current)->_pos_y_1 = (char)(0x3021 >> 8);
    (iVar42._M_current)->_extra_byte_1 = 2;
    (iVar42._M_current)->field_0x5 = local_2f8.position.half_y;
    (iVar42._M_current)->_map_id_2 = local_2f8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pmVar1 = local_2a8;
  local_2f8.type_id = 0xe1;
  local_2f8.position.x = '\0';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(local_2a8,(key_type *)&local_2f8);
  pMVar41 = *ppMVar36;
  local_2f8.type_id = 'Z';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_layout = (*ppMVar36)->_layout;
  local_2f8.type_id = 'Z';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_blockset = (*ppMVar36)->_blockset;
  pMVar41->_palette = palette;
  pMVar41->_background_music = '\x14';
  local_2f8.palette = 0xce;
  local_2f8.speed = '\0';
  local_2f8.fightable = false;
  local_2f8.liftable = false;
  local_2f8.type_id = 0xb0;
  local_2f8.position.x = '+';
  local_2f8.position.y = '&';
  local_2f8.position.z = '\0';
  local_2f8.position.half_x = false;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\0';
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&pMVar41->_global_entity_mask_flags,(GlobalEntityMaskFlag *)&local_2f8);
  pEVar39 = (Entity *)operator_new(0x58);
  local_2f8.type_id = 'h';
  local_2f8.position.x = '\x19';
  local_2f8.position.y = '\x11';
  local_2f8.position.z = '\x02';
  local_2f8.position.half_x = false;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\0';
  local_2f8.palette = '\0';
  local_2f8.speed = '\0';
  local_2f8.fightable = false;
  local_2f8.liftable = false;
  local_2f8.can_pass_through = false;
  local_2f8.appear_after_player_moved_away = false;
  local_2f8.gravity_immune = false;
  local_2f8.talkable = false;
  local_2f8.dialogue = '\0';
  local_2f8.behavior_id = 0x6a;
  local_2f8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_2f8.persistence_flag.byte = 0xff;
  local_2f8.persistence_flag.bit = 0xff;
  local_2f8.flag_unknown_2_3 = false;
  local_2f8.flag_unknown_2_4 = false;
  local_2f8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_2f8);
  Map::add_entity(pMVar41,pEVar39);
  if (local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_238[0] = 'Q';
  local_238[1] = '\x19';
  local_238[2] = '\x12';
  local_238[3] = '\x05';
  local_238[4] = true;
  local_238[5] = false;
  local_238[6] = false;
  local_238[7] = '\0';
  aStack_228._M_allocated_capacity._2_2_ = 0;
  local_238[8] = '\x01';
  local_238[9] = '\0';
  local_238[10] = false;
  local_238[0xb] = false;
  uStack_22c._0_1_ = false;
  uStack_22c._1_1_ = false;
  uStack_22c._2_1_ = false;
  uStack_22c._3_1_ = false;
  aStack_228._M_local_buf[0] = '\0';
  aStack_228._8_8_ = (Entity *)0x0;
  pEStack_218 = (pointer)0x0;
  local_210 = (pointer)0x0;
  pEStack_208 = (pointer)0x0;
  local_200 = &PTR_to_json_abi_cxx11__00262898;
  local_1f8 = 0xff;
  local_1f6 = 0xff;
  local_1f0._0_1_ = false;
  local_1f0._1_1_ = false;
  local_1ee = false;
  Entity::Entity(pEVar39,(Attributes *)local_238);
  pRVar30 = local_290;
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_218 != (pointer)0x0) {
    operator_delete(pEStack_218,(long)pEStack_208 - (long)pEStack_218);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_288[0] = 'g';
  local_288[1] = '\x19';
  local_288[2] = '!';
  local_288[3] = '\x02';
  bStack_27c = false;
  local_288[4] = false;
  local_288[5] = false;
  local_288[6] = false;
  local_288[7] = '\0';
  local_288[8] = '\0';
  local_288[9] = '\0';
  local_288[10] = false;
  local_288[0xb] = false;
  uStack_27b._0_1_ = true;
  uStack_27b._1_1_ = false;
  bStack_279 = false;
  aStack_278._M_local_buf[0] = '\0';
  aStack_278._M_allocated_capacity._2_2_ = 0x6a;
  aStack_278._8_8_ = (Entity *)0x0;
  pEStack_268 = (pointer)0x0;
  local_260 = (pointer)0x0;
  pEStack_258 = (pointer)0x0;
  local_250 = &PTR_to_json_abi_cxx11__00262898;
  local_248 = 0xff;
  local_246 = 0xff;
  local_240._0_1_ = false;
  local_240._1_1_ = false;
  local_23e = false;
  Entity::Entity(pEVar39,(Attributes *)local_288);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_268 != (pointer)0x0) {
    operator_delete(pEStack_268,(long)pEStack_258 - (long)pEStack_268);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_1e0.type_id = 0xaa;
  local_1e0.position.x = '\x15';
  local_1e0.position.y = '\x19';
  local_1e0.position.z = '\b';
  local_1e0.position.half_x = false;
  local_1e0.position.half_y = false;
  local_1e0.position.half_z = false;
  local_1e0.orientation = '\x01';
  local_1e0.behavior_id = 0;
  local_1e0.palette = '\x01';
  local_1e0.speed = '\0';
  local_1e0.fightable = false;
  local_1e0.liftable = false;
  local_1e0.can_pass_through = false;
  local_1e0.appear_after_player_moved_away = false;
  local_1e0.gravity_immune = false;
  local_1e0.talkable = false;
  local_1e0.dialogue = '\0';
  local_1e0.entity_to_use_tiles_from = (Entity *)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_1e0.persistence_flag.byte = 0xff;
  local_1e0.persistence_flag.bit = 0xff;
  local_1e0.flag_unknown_2_3 = false;
  local_1e0.flag_unknown_2_4 = false;
  local_1e0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_1e0);
  Map::add_entity(pMVar41,pEVar39);
  if (local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_188.type_id = 0xaa;
  local_188.position.x = '\x1e';
  local_188.position.y = '\x19';
  local_188.position.z = '\b';
  local_188.position.half_x = false;
  local_188.position.half_y = false;
  local_188.position.half_z = false;
  local_188.orientation = '\x03';
  local_188.palette = '\x01';
  local_188.behavior_id = 0;
  local_188.speed = '\0';
  local_188.fightable = false;
  local_188.liftable = false;
  local_188.can_pass_through = false;
  local_188.appear_after_player_moved_away = false;
  local_188.gravity_immune = false;
  local_188.talkable = false;
  local_188.dialogue = '\0';
  local_188.entity_to_use_tiles_from = (Entity *)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_188);
  Map::add_entity(pMVar41,pEVar39);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar29->_room_3 = pMVar41;
  local_2f8._0_2_ = pPVar29->_room_2->_id;
  local_2f8._6_2_ = pMVar41->_id;
  local_2f8.position.y = '\x19';
  local_2f8.position.z = '\x17';
  local_2f8.position.half_x = true;
  local_2f8.palette = '\x19';
  local_2f8.speed = '\"';
  local_2f8.fightable = false;
  iVar42._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar42._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar42,(MapConnection *)&local_2f8);
  }
  else {
    (iVar42._M_current)->_pos_x_2 = (char)0x2219;
    (iVar42._M_current)->_pos_y_2 = (char)(0x2219 >> 8);
    (iVar42._M_current)->_extra_byte_2 = (char)(0x2219 >> 0x10);
    (iVar42._M_current)->field_0xb = local_2f8.liftable;
    (iVar42._M_current)->_map_id_1 = local_2f8._0_2_;
    (iVar42._M_current)->_pos_x_1 = (char)0x1719;
    (iVar42._M_current)->_pos_y_1 = (char)(0x1719 >> 8);
    (iVar42._M_current)->_extra_byte_1 = 2;
    (iVar42._M_current)->field_0x5 = local_2f8.position.half_y;
    (iVar42._M_current)->_map_id_2 = local_2f8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pmVar1 = local_2a8;
  local_2f8.type_id = '=';
  local_2f8.position.x = '\0';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(local_2a8,(key_type *)&local_2f8);
  pMVar41 = *ppMVar36;
  local_2f8.type_id = 'H';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_layout = (*ppMVar36)->_layout;
  local_2f8.type_id = 'H';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_blockset = (*ppMVar36)->_blockset;
  pMVar41->_palette = palette;
  pMVar41->_background_music = '\x14';
  (pMVar41->_visited_flag).bit = '\0';
  (pMVar41->_visited_flag).byte = 0xce;
  local_2f8.palette = 0xce;
  local_2f8.speed = '\0';
  local_2f8.fightable = true;
  local_2f8.liftable = false;
  local_2f8.type_id = 0xb0;
  local_2f8.position.x = '+';
  local_2f8.position.y = '&';
  local_2f8.position.z = '\0';
  local_2f8.position.half_x = false;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\0';
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&pMVar41->_global_entity_mask_flags,(GlobalEntityMaskFlag *)&local_2f8);
  pEVar39 = (Entity *)operator_new(0x58);
  local_2f8.type_id = '\x1c';
  local_2f8.position.x = '\x17';
  local_2f8.position.y = '\x13';
  local_2f8.position.z = '\b';
  local_2f8.behavior_id = 0;
  local_2f8.position.half_x = false;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\0';
  local_2f8.palette = '\0';
  local_2f8.speed = '\0';
  local_2f8.fightable = false;
  local_2f8.liftable = false;
  local_2f8.can_pass_through = false;
  local_2f8.appear_after_player_moved_away = false;
  local_2f8.gravity_immune = false;
  local_2f8.talkable = false;
  local_2f8.dialogue = '\0';
  local_2f8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_2f8.persistence_flag.byte = 0xff;
  local_2f8.persistence_flag.bit = 0xff;
  local_2f8.flag_unknown_2_3 = false;
  local_2f8.flag_unknown_2_4 = false;
  local_2f8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_2f8);
  Map::add_entity(pMVar41,pEVar39);
  if (local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_238[0] = '\x1c';
  local_238[1] = '\x1f';
  local_238[2] = '\x13';
  local_238[3] = '\b';
  aStack_228._M_allocated_capacity._2_2_ = 0;
  local_238[4] = false;
  local_238[5] = false;
  local_238[6] = false;
  local_238[7] = '\0';
  local_238[8] = '\0';
  local_238[9] = '\0';
  local_238[10] = false;
  local_238[0xb] = false;
  uStack_22c._0_1_ = false;
  uStack_22c._1_1_ = false;
  uStack_22c._2_1_ = false;
  uStack_22c._3_1_ = false;
  aStack_228._M_local_buf[0] = '\0';
  aStack_228._8_8_ = (Entity *)0x0;
  pEStack_218 = (pointer)0x0;
  local_210 = (pointer)0x0;
  pEStack_208 = (pointer)0x0;
  local_200 = &PTR_to_json_abi_cxx11__00262898;
  local_1f8 = 0xff;
  local_1f6 = 0xff;
  local_1f0._0_1_ = false;
  local_1f0._1_1_ = false;
  local_1ee = false;
  Entity::Entity(pEVar39,(Attributes *)local_238);
  pRVar30 = local_290;
  pPVar29 = local_2a0;
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_218 != (pointer)0x0) {
    operator_delete(pEStack_218,(long)pEStack_208 - (long)pEStack_218);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_288[0] = '\x1c';
  local_288[1] = '\x13';
  local_288[2] = '\x17';
  local_288[3] = '\b';
  aStack_278._M_allocated_capacity._2_2_ = 0;
  local_288[4] = false;
  local_288[5] = false;
  local_288[6] = false;
  local_288[7] = '\0';
  local_288[8] = '\0';
  local_288[9] = '\0';
  local_288[10] = false;
  local_288[0xb] = false;
  bStack_27c = false;
  uStack_27b._0_1_ = false;
  uStack_27b._1_1_ = false;
  bStack_279 = false;
  aStack_278._M_local_buf[0] = '\0';
  aStack_278._8_8_ = (Entity *)0x0;
  pEStack_268 = (pointer)0x0;
  local_260 = (pointer)0x0;
  pEStack_258 = (pointer)0x0;
  local_250 = &PTR_to_json_abi_cxx11__00262898;
  local_248 = 0xff;
  local_246 = 0xff;
  local_240._0_1_ = false;
  local_240._1_1_ = false;
  local_23e = false;
  Entity::Entity(pEVar39,(Attributes *)local_288);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_268 != (pointer)0x0) {
    operator_delete(pEStack_268,(long)pEStack_258 - (long)pEStack_268);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_1e0.type_id = '\x1c';
  local_1e0.position.x = '\x13';
  local_1e0.position.y = '\x1f';
  local_1e0.position.z = '\b';
  local_1e0.behavior_id = 0;
  local_1e0.position.half_x = false;
  local_1e0.position.half_y = false;
  local_1e0.position.half_z = false;
  local_1e0.orientation = '\0';
  local_1e0.palette = '\0';
  local_1e0.speed = '\0';
  local_1e0.fightable = false;
  local_1e0.liftable = false;
  local_1e0.can_pass_through = false;
  local_1e0.appear_after_player_moved_away = false;
  local_1e0.gravity_immune = false;
  local_1e0.talkable = false;
  local_1e0.dialogue = '\0';
  local_1e0.entity_to_use_tiles_from = (Entity *)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_1e0.persistence_flag.byte = 0xff;
  local_1e0.persistence_flag.bit = 0xff;
  local_1e0.flag_unknown_2_3 = false;
  local_1e0.flag_unknown_2_4 = false;
  local_1e0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_1e0);
  Map::add_entity(pMVar41,pEVar39);
  if (local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_188.type_id = 'g';
  local_188.position.x = '\x19';
  local_188.position.y = '!';
  local_188.liftable = false;
  local_188.can_pass_through = false;
  local_188.position.z = '\0';
  local_188.position.half_x = false;
  local_188.position.half_y = false;
  local_188.position.half_z = false;
  local_188.orientation = '\0';
  local_188.palette = '\0';
  local_188.speed = '\0';
  local_188.fightable = false;
  local_188.appear_after_player_moved_away = true;
  local_188.gravity_immune = false;
  local_188.talkable = false;
  local_188.dialogue = '\0';
  local_188.behavior_id = 0x6a;
  local_188.entity_to_use_tiles_from = (Entity *)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_188);
  Map::add_entity(pMVar41,pEVar39);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_138.type_id = 'g';
  local_138.position.x = '!';
  local_138.position.y = '\x19';
  local_138.position.z = '\0';
  local_138.position.half_x = false;
  local_138.position.half_y = false;
  local_138.position.half_z = false;
  local_138.orientation = '\x01';
  local_138.dialogue = '\0';
  local_138.palette = '\0';
  local_138.speed = '\0';
  local_138.fightable = false;
  local_138.liftable = false;
  local_138.can_pass_through = false;
  local_138.appear_after_player_moved_away = false;
  local_138.gravity_immune = false;
  local_138.talkable = false;
  local_138.behavior_id = 0x6a;
  local_138.entity_to_use_tiles_from = (Entity *)0x0;
  local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_138.persistence_flag.byte = 0xff;
  local_138.persistence_flag.bit = 0xff;
  local_138.flag_unknown_2_3 = false;
  local_138.flag_unknown_2_4 = false;
  local_138.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_138);
  Map::add_entity(pMVar41,pEVar39);
  if (local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_d0.type_id = 'Q';
  local_d0.position.x = ' ';
  local_d0.position.y = '\x19';
  local_d0.position.z = '\x04';
  local_d0.position.half_x = true;
  local_d0.position.half_y = true;
  local_d0.position.half_z = false;
  local_d0.orientation = '\0';
  local_d0.palette = '\x01';
  local_d0.behavior_id = 0;
  local_d0.speed = '\0';
  local_d0.fightable = false;
  local_d0.liftable = false;
  local_d0.can_pass_through = false;
  local_d0.appear_after_player_moved_away = false;
  local_d0.gravity_immune = false;
  local_d0.talkable = false;
  local_d0.dialogue = '\0';
  local_d0.entity_to_use_tiles_from = (Entity *)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_d0.persistence_flag.byte = 0xff;
  local_d0.persistence_flag.bit = 0xff;
  local_d0.flag_unknown_2_3 = false;
  local_d0.flag_unknown_2_4 = false;
  local_d0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_d0);
  Map::add_entity(pMVar41,pEVar39);
  if (local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar29->_room_4 = pMVar41;
  local_2f8._0_2_ = pPVar29->_room_3->_id;
  local_2f8._6_2_ = pMVar41->_id;
  local_2f8.position.y = '\x19';
  local_2f8.position.z = '\x13';
  local_2f8.position.half_x = true;
  local_2f8.palette = '\x19';
  local_2f8.speed = '\"';
  local_2f8.fightable = false;
  iVar42._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar42._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar42,(MapConnection *)&local_2f8);
  }
  else {
    (iVar42._M_current)->_pos_x_2 = (char)0x2219;
    (iVar42._M_current)->_pos_y_2 = (char)(0x2219 >> 8);
    (iVar42._M_current)->_extra_byte_2 = (char)(0x2219 >> 0x10);
    (iVar42._M_current)->field_0xb = local_2f8.liftable;
    (iVar42._M_current)->_map_id_1 = local_2f8._0_2_;
    (iVar42._M_current)->_pos_x_1 = (char)0x1319;
    (iVar42._M_current)->_pos_y_1 = (char)(0x1319 >> 8);
    (iVar42._M_current)->_extra_byte_1 = 2;
    (iVar42._M_current)->field_0x5 = local_2f8.position.half_y;
    (iVar42._M_current)->_map_id_2 = local_2f8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pmVar1 = local_2a8;
  local_2f8.type_id = '>';
  local_2f8.position.x = '\0';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(local_2a8,(key_type *)&local_2f8);
  pMVar41 = *ppMVar36;
  local_2f8.type_id = '7';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_layout = (*ppMVar36)->_layout;
  local_2f8.type_id = '7';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_blockset = (*ppMVar36)->_blockset;
  pMVar41->_palette = palette;
  pMVar41->_background_music = '\x14';
  (pMVar41->_visited_flag).bit = '\x01';
  (pMVar41->_visited_flag).byte = 0xce;
  local_2f8.palette = 0xce;
  local_2f8.speed = '\0';
  local_2f8.fightable = true;
  local_2f8.liftable = true;
  local_2f8.type_id = 0xb0;
  local_2f8.position.x = '+';
  local_2f8.position.y = '&';
  local_2f8.position.z = '\0';
  local_2f8.position.half_x = false;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\0';
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&pMVar41->_global_entity_mask_flags,(GlobalEntityMaskFlag *)&local_2f8);
  pEVar39 = (Entity *)operator_new(0x58);
  local_2f8.type_id = 'U';
  local_2f8.position.x = ' ';
  local_2f8.position.y = '\x13';
  local_2f8.position.z = '\x02';
  local_2f8.position.half_x = false;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\0';
  local_2f8.palette = '\x01';
  local_2f8.speed = '\0';
  local_2f8.fightable = false;
  local_2f8.liftable = false;
  local_2f8.can_pass_through = false;
  local_2f8.appear_after_player_moved_away = false;
  local_2f8.gravity_immune = false;
  local_2f8.talkable = false;
  local_2f8.dialogue = '\0';
  local_2f8.behavior_id = 0xd3;
  local_2f8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_2f8.persistence_flag.byte = 0xff;
  local_2f8.persistence_flag.bit = 0xff;
  local_2f8.flag_unknown_2_3 = false;
  local_2f8.flag_unknown_2_4 = false;
  local_2f8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_2f8);
  Map::add_entity(pMVar41,pEVar39);
  if (local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_238[0] = 'g';
  local_238[1] = '\x19';
  local_238[2] = '!';
  local_238[3] = '\x02';
  local_238[4] = false;
  local_238[5] = false;
  local_238[6] = false;
  local_238[7] = '\0';
  local_238[8] = '\0';
  local_238[9] = '\0';
  local_238[10] = false;
  local_238[0xb] = false;
  uStack_22c._0_1_ = false;
  uStack_22c._1_1_ = false;
  uStack_22c._2_1_ = false;
  uStack_22c._3_1_ = false;
  aStack_228._M_local_buf[0] = '\0';
  aStack_228._M_allocated_capacity._2_2_ = 0x380;
  aStack_228._8_8_ = (Entity *)0x0;
  pEStack_218 = (pointer)0x0;
  local_210 = (pointer)0x0;
  pEStack_208 = (pointer)0x0;
  local_200 = &PTR_to_json_abi_cxx11__00262898;
  local_1f8 = 0xff;
  local_1f6 = 0xff;
  local_1f0._0_1_ = false;
  local_1f0._1_1_ = false;
  local_1ee = false;
  Entity::Entity(pEVar39,(Attributes *)local_238);
  pRVar30 = local_290;
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_218 != (pointer)0x0) {
    operator_delete(pEStack_218,(long)pEStack_208 - (long)pEStack_218);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_288[0] = 'h';
  local_288[1] = '\x11';
  local_288[2] = '\x19';
  local_288[3] = '\x02';
  local_288[4] = false;
  local_288[5] = false;
  local_288[6] = false;
  local_288[7] = '\x01';
  aStack_278._M_local_buf[0] = '\0';
  local_288[8] = '\0';
  local_288[9] = '\0';
  local_288[10] = false;
  local_288[0xb] = false;
  bStack_27c = false;
  uStack_27b._0_1_ = false;
  uStack_27b._1_1_ = false;
  bStack_279 = false;
  aStack_278._M_allocated_capacity._2_2_ = 0x6a;
  aStack_278._8_8_ = (Entity *)0x0;
  pEStack_268 = (pointer)0x0;
  local_260 = (pointer)0x0;
  pEStack_258 = (pointer)0x0;
  local_250 = &PTR_to_json_abi_cxx11__00262898;
  local_248 = 0xff;
  local_246 = 0xff;
  local_240._0_1_ = false;
  local_240._1_1_ = false;
  local_23e = false;
  Entity::Entity(pEVar39,(Attributes *)local_288);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_268 != (pointer)0x0) {
    operator_delete(pEStack_268,(long)pEStack_258 - (long)pEStack_268);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_1e0.type_id = '(';
  local_1e0.position.x = '\x19';
  local_1e0.position.y = '\x19';
  local_1e0.position.z = '\x03';
  local_1e0.position.half_x = true;
  local_1e0.position.half_y = true;
  local_1e0.behavior_id = 0;
  local_1e0.position.half_z = false;
  local_1e0.orientation = '\0';
  local_1e0.palette = '\0';
  local_1e0.speed = '\0';
  local_1e0.fightable = false;
  local_1e0.liftable = false;
  local_1e0.can_pass_through = false;
  local_1e0.appear_after_player_moved_away = false;
  local_1e0.gravity_immune = false;
  local_1e0.talkable = false;
  local_1e0.dialogue = '\0';
  local_1e0.entity_to_use_tiles_from = (Entity *)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_1e0.persistence_flag.byte = 0xff;
  local_1e0.persistence_flag.bit = 0xff;
  local_1e0.flag_unknown_2_3 = false;
  local_1e0.flag_unknown_2_4 = false;
  local_1e0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_1e0);
  Map::add_entity(pMVar41,pEVar39);
  if (local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar29->_room_5 = pMVar41;
  local_2f8._0_2_ = pMVar41->_id;
  local_2f8._6_2_ = pPVar29->_room_4->_id;
  local_2f8.position.y = '\x13';
  local_2f8.position.z = '\x19';
  local_2f8.position.half_x = true;
  local_2f8.palette = '\"';
  local_2f8.speed = '\x19';
  local_2f8.fightable = false;
  iVar42._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar42._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar42,(MapConnection *)&local_2f8);
  }
  else {
    (iVar42._M_current)->_pos_x_2 = (char)0x1922;
    (iVar42._M_current)->_pos_y_2 = (char)(0x1922 >> 8);
    (iVar42._M_current)->_extra_byte_2 = (char)(0x1922 >> 0x10);
    (iVar42._M_current)->field_0xb = local_2f8.liftable;
    (iVar42._M_current)->_map_id_1 = local_2f8._0_2_;
    (iVar42._M_current)->_pos_x_1 = (char)0x1913;
    (iVar42._M_current)->_pos_y_1 = (char)(0x1913 >> 8);
    (iVar42._M_current)->_extra_byte_1 = 4;
    (iVar42._M_current)->field_0x5 = local_2f8.position.half_y;
    (iVar42._M_current)->_map_id_2 = local_2f8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pmVar1 = local_2a8;
  local_2f8.type_id = '<';
  local_2f8.position.x = '\0';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(local_2a8,(key_type *)&local_2f8);
  pMVar41 = *ppMVar36;
  local_2f8.type_id = 'b';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_layout = (*ppMVar36)->_layout;
  local_2f8.type_id = 'b';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_blockset = (*ppMVar36)->_blockset;
  pMVar41->_palette = palette;
  pMVar41->_background_music = '\x14';
  (pMVar41->_visited_flag).byte = 0xce;
  (pMVar41->_visited_flag).bit = '\x02';
  local_2f8.palette = 0xce;
  local_2f8.speed = '\0';
  local_2f8.fightable = true;
  local_2f8.liftable = false;
  local_2f8.type_id = 0xb0;
  local_2f8.position.x = '+';
  local_2f8.position.y = '&';
  local_2f8.position.z = '\0';
  local_2f8.position.half_x = false;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\0';
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::
  emplace_back<GlobalEntityMaskFlag>
            (&pMVar41->_global_entity_mask_flags,(GlobalEntityMaskFlag *)&local_2f8);
  pEVar39 = (Entity *)operator_new(0x58);
  local_2f8.type_id = 0xab;
  local_2f8.position.x = '\x19';
  local_2f8.position.y = '\x1a';
  local_2f8.position.z = '\x02';
  local_2f8.position.half_x = false;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\0';
  local_2f8.palette = '\x01';
  local_2f8.behavior_id = 0;
  local_2f8.speed = '\0';
  local_2f8.fightable = false;
  local_2f8.liftable = false;
  local_2f8.can_pass_through = false;
  local_2f8.appear_after_player_moved_away = false;
  local_2f8.gravity_immune = false;
  local_2f8.talkable = false;
  local_2f8.dialogue = '\0';
  local_2f8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_2f8.persistence_flag.byte = 0xff;
  local_2f8.persistence_flag.bit = 0xff;
  local_2f8.flag_unknown_2_3 = false;
  local_2f8.flag_unknown_2_4 = false;
  local_2f8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_2f8);
  Map::add_entity(pMVar41,pEVar39);
  if (local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_238[0] = 'h';
  local_238[1] = '\x11';
  local_238[2] = '\x19';
  local_238[3] = '\x02';
  local_238[4] = false;
  local_238[5] = false;
  local_238[6] = false;
  local_238[7] = '\x01';
  aStack_228._M_allocated_capacity._2_2_ = 0;
  aStack_228._M_local_buf[0] = '\0';
  local_238[8] = '\0';
  local_238[9] = '\0';
  local_238[10] = false;
  local_238[0xb] = false;
  uStack_22c._0_1_ = false;
  uStack_22c._1_1_ = false;
  uStack_22c._2_1_ = false;
  uStack_22c._3_1_ = false;
  aStack_228._8_8_ = (Entity *)0x0;
  pEStack_218 = (pointer)0x0;
  local_210 = (pointer)0x0;
  pEStack_208 = (pointer)0x0;
  local_200 = &PTR_to_json_abi_cxx11__00262898;
  local_1f8 = 0xff;
  local_1f6 = 0xff;
  local_1f0._0_1_ = false;
  local_1f0._1_1_ = false;
  local_1ee = false;
  Entity::Entity(pEVar39,(Attributes *)local_238);
  pRVar30 = local_290;
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_218 != (pointer)0x0) {
    operator_delete(pEStack_218,(long)pEStack_208 - (long)pEStack_218);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_288[0] = 'h';
  local_288[1] = '\x19';
  local_288[2] = '\x11';
  local_288[3] = '\x02';
  aStack_278._M_allocated_capacity._2_2_ = 0;
  local_288[4] = false;
  local_288[5] = false;
  local_288[6] = false;
  local_288[7] = '\0';
  local_288[8] = '\0';
  local_288[9] = '\0';
  local_288[10] = false;
  local_288[0xb] = false;
  bStack_27c = false;
  uStack_27b._0_1_ = false;
  uStack_27b._1_1_ = false;
  bStack_279 = false;
  aStack_278._M_local_buf[0] = '\0';
  aStack_278._8_8_ = (Entity *)0x0;
  pEStack_268 = (pointer)0x0;
  local_260 = (pointer)0x0;
  pEStack_258 = (pointer)0x0;
  local_250 = &PTR_to_json_abi_cxx11__00262898;
  local_248 = 0xff;
  local_246 = 0xff;
  local_240._0_1_ = false;
  local_240._1_1_ = false;
  local_23e = false;
  Entity::Entity(pEVar39,(Attributes *)local_288);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_268 != (pointer)0x0) {
    operator_delete(pEStack_268,(long)pEStack_258 - (long)pEStack_268);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_1e0.type_id = 'g';
  local_1e0.position.x = '!';
  local_1e0.position.y = '\x19';
  local_1e0.position.z = '\x02';
  local_1e0.position.half_x = false;
  local_1e0.position.half_y = false;
  local_1e0.position.half_z = false;
  local_1e0.orientation = '\x01';
  local_1e0.dialogue = '\0';
  local_1e0.palette = '\0';
  local_1e0.speed = '\0';
  local_1e0.fightable = false;
  local_1e0.liftable = false;
  local_1e0.can_pass_through = false;
  local_1e0.appear_after_player_moved_away = false;
  local_1e0.gravity_immune = false;
  local_1e0.talkable = false;
  local_1e0.behavior_id = 0x6a;
  local_1e0.entity_to_use_tiles_from = (Entity *)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_1e0.persistence_flag.byte = 0xff;
  local_1e0.persistence_flag.bit = 0xff;
  local_1e0.flag_unknown_2_3 = false;
  local_1e0.flag_unknown_2_4 = false;
  local_1e0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_1e0);
  Map::add_entity(pMVar41,pEVar39);
  if (local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pPVar29->_room_6 = pMVar41;
  local_2f8._0_2_ = pMVar41->_id;
  local_2f8._6_2_ = pPVar29->_room_5->_id;
  local_2f8.position.y = '\x19';
  local_2f8.position.z = '\x13';
  local_2f8.position.half_x = true;
  local_2f8.palette = '\x19';
  local_2f8.speed = '\"';
  local_2f8.fightable = false;
  iVar42._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar42._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar42,(MapConnection *)&local_2f8);
    iVar42._M_current =
         (pRVar30->super_World)._map_connections.
         super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (iVar42._M_current)->_pos_x_2 = (char)0x2219;
    (iVar42._M_current)->_pos_y_2 = (char)(0x2219 >> 8);
    (iVar42._M_current)->_extra_byte_2 = (char)(0x2219 >> 0x10);
    (iVar42._M_current)->field_0xb = local_2f8.liftable;
    (iVar42._M_current)->_map_id_1 = local_2f8._0_2_;
    (iVar42._M_current)->_pos_x_1 = (char)0x1319;
    (iVar42._M_current)->_pos_y_1 = (char)(0x1319 >> 8);
    (iVar42._M_current)->_extra_byte_1 = 2;
    (iVar42._M_current)->field_0x5 = local_2f8.position.half_y;
    (iVar42._M_current)->_map_id_2 = local_2f8._6_2_;
    iVar42._M_current =
         (pRVar30->super_World)._map_connections.
         super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (pRVar30->super_World)._map_connections.
    super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar42._M_current;
  }
  local_2f8._0_2_ = pPVar29->_room_6->_id;
  local_2f8._6_2_ = pPVar29->_room_2->_id;
  local_2f8.position.y = '\x13';
  local_2f8.position.z = '\x19';
  local_2f8.position.half_x = true;
  local_2f8.palette = '\"';
  local_2f8.speed = '\x19';
  local_2f8.fightable = false;
  if (iVar42._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar42,(MapConnection *)&local_2f8);
  }
  else {
    (iVar42._M_current)->_pos_x_2 = (char)0x1922;
    (iVar42._M_current)->_pos_y_2 = (char)(0x1922 >> 8);
    (iVar42._M_current)->_extra_byte_2 = (char)(0x1922 >> 0x10);
    (iVar42._M_current)->field_0xb = local_2f8.liftable;
    (iVar42._M_current)->_map_id_1 = local_2f8._0_2_;
    (iVar42._M_current)->_pos_x_1 = (char)0x1913;
    (iVar42._M_current)->_pos_y_1 = (char)(0x1913 >> 8);
    (iVar42._M_current)->_extra_byte_1 = 4;
    (iVar42._M_current)->field_0x5 = local_2f8.position.half_y;
    (iVar42._M_current)->_map_id_2 = local_2f8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pmVar1 = local_2a8;
  local_2f8.type_id = 'O';
  local_2f8.position.x = '\0';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(local_2a8,(key_type *)&local_2f8);
  pMVar41 = *ppMVar36;
  local_2f8.type_id = 'V';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_layout = (*ppMVar36)->_layout;
  local_2f8.type_id = 'V';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_blockset = (*ppMVar36)->_blockset;
  pMVar41->_palette = palette;
  (pMVar41->_visited_flag).byte = 0xce;
  (pMVar41->_visited_flag).bit = '\x03';
  pMVar41->_background_music = '\x0f';
  pEVar39 = (Entity *)operator_new(0x58);
  local_2f8.type_id = 0xa5;
  local_2f8.position.x = '\x19';
  local_2f8.position.y = '\x13';
  local_2f8.position.z = '\x04';
  local_2f8.position.half_x = true;
  local_2f8.position.half_y = true;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\x02';
  local_2f8.behavior_id = 0;
  local_2f8.dialogue = '\0';
  local_2f8.palette = '\0';
  local_2f8.speed = '\0';
  local_2f8.fightable = false;
  local_2f8.liftable = false;
  local_2f8.can_pass_through = false;
  local_2f8.appear_after_player_moved_away = false;
  local_2f8.gravity_immune = false;
  local_2f8.talkable = false;
  local_2f8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_2f8.persistence_flag.byte = 0xff;
  local_2f8.persistence_flag.bit = 0xff;
  local_2f8.flag_unknown_2_3 = false;
  local_2f8.flag_unknown_2_4 = false;
  local_2f8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_2f8);
  if (local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (pEVar39->_attrs).fightable = false;
  (pEVar39->_attrs).behavior_id = 0;
  Map::add_entity(pMVar41,pEVar39);
  pEVar39 = (Entity *)operator_new(0x58);
  local_238[0] = 0x9c;
  local_238[1] = '\x13';
  local_238[2] = '\x1f';
  local_238[3] = '\x02';
  local_238[4] = false;
  local_238[5] = false;
  local_238[6] = false;
  local_238[7] = '\x01';
  aStack_228._M_allocated_capacity._2_2_ = 0;
  local_238[8] = '\x03';
  local_238[9] = '\0';
  local_238[10] = false;
  local_238[0xb] = false;
  uStack_22c._0_1_ = false;
  uStack_22c._1_1_ = false;
  uStack_22c._2_1_ = false;
  uStack_22c._3_1_ = false;
  aStack_228._M_local_buf[0] = '\0';
  aStack_228._8_8_ = (Entity *)0x0;
  pEStack_218 = (pointer)0x0;
  local_210 = (pointer)0x0;
  pEStack_208 = (pointer)0x0;
  local_200 = &PTR_to_json_abi_cxx11__00262898;
  local_1f8 = 0xff;
  local_1f6 = 0xff;
  local_1f0._0_1_ = false;
  local_1f0._1_1_ = false;
  local_1ee = false;
  Entity::Entity(pEVar39,(Attributes *)local_238);
  if (pEStack_218 != (pointer)0x0) {
    operator_delete(pEStack_218,(long)pEStack_208 - (long)pEStack_218);
  }
  Map::add_entity(pMVar41,pEVar39);
  local_288._0_4_ = SUB84(&aStack_278,0);
  local_288[4] = SUB81((ulong)&aStack_278 >> 0x20,0);
  local_288[5] = SUB81((ulong)&aStack_278 >> 0x28,0);
  local_288[6] = SUB81((ulong)&aStack_278 >> 0x30,0);
  local_288[7] = (uint8_t)((ulong)&aStack_278 >> 0x38);
  local_1e0.type_id = 0xd7;
  local_1e0.position.x = '\0';
  local_1e0.position.y = '\0';
  local_1e0.position.z = '\0';
  local_1e0.position.half_x = false;
  local_1e0.position.half_y = false;
  local_1e0.position.half_z = false;
  local_1e0.orientation = '\0';
  pcVar40 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288
                      ,(size_type *)&local_1e0,0);
  uVar34 = local_1e0._6_2_;
  uVar33 = local_1e0.position._3_2_;
  uVar31 = local_1e0._0_4_;
  local_288._0_4_ = SUB84(pcVar40,0);
  local_288[4] = SUB81((ulong)pcVar40 >> 0x20,0);
  local_288[5] = SUB81((ulong)pcVar40 >> 0x28,0);
  local_288[6] = SUB81((ulong)pcVar40 >> 0x30,0);
  local_288[7] = (uint8_t)((ulong)pcVar40 >> 0x38);
  lVar43 = CONCAT26(local_1e0._6_2_,CONCAT24(local_1e0.position._3_2_,local_1e0._0_4_));
  aStack_278._M_local_buf[0] = local_1e0.type_id;
  aStack_278._M_local_buf[1] = local_1e0.position.x;
  aStack_278._M_allocated_capacity._2_2_ = local_1e0.position._1_2_;
  aStack_278._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar43 >> 0x20);
  memcpy(pcVar40,
         "Foxy: The final challenge is very\nclose, you should take some rest.\x1e\nYou are about to fight the very\nsource of Gola\'s power, what made\nits reign of terror possible.\x1e\nPlease set this island free,\nonce and for all...\x03"
         ,0xd7);
  uVar32 = local_1e0._0_4_;
  pRVar30 = local_290;
  local_1e0.type_id = (uint8_t)uVar31;
  local_1e0.position.x = SUB41(uVar31,1);
  local_1e0.position.y = SUB41(uVar31,2);
  local_1e0.position.z = SUB41(uVar31,3);
  local_288[8] = local_1e0.type_id;
  local_288[9] = local_1e0.position.x;
  local_288[10] = local_1e0.position.y;
  local_288[0xb] = local_1e0.position.z;
  bStack_27c = SUB21(uVar33,0);
  uStack_27b = (undefined2)((ulong)lVar43 >> 0x28);
  bStack_279 = SUB21(uVar34,1);
  pcVar40[lVar43] = '\0';
  local_1e0._0_4_ = uVar32;
  RandomizerWorld::add_custom_dialogue_raw(local_290,pEVar39,(string *)local_288);
  paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT17(local_288[7],
                        CONCAT16(local_288[6],
                                 CONCAT15(local_288[5],CONCAT14(local_288[4],local_288._0_4_))));
  if (paVar28 != &aStack_278) {
    operator_delete(paVar28,CONCAT44(aStack_278._M_allocated_capacity._4_4_,
                                     CONCAT22(aStack_278._M_allocated_capacity._2_2_,
                                              CONCAT11(aStack_278._M_local_buf[1],
                                                       aStack_278._M_local_buf[0]))) + 1);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_288[0] = 0xc0;
  local_288[1] = '\x15';
  local_288[2] = '\x13';
  local_288[3] = '\x03';
  local_288[4] = false;
  local_288[5] = false;
  local_288[6] = false;
  local_288[7] = '\0';
  local_288[8] = '\x01';
  local_288[9] = '\0';
  local_288[10] = false;
  local_288[0xb] = true;
  bStack_27c = false;
  uStack_27b._0_1_ = false;
  uStack_27b._1_1_ = false;
  bStack_279 = false;
  aStack_278._M_allocated_capacity._2_2_ = 0;
  aStack_278._M_local_buf[0] = '\0';
  aStack_278._8_8_ = (Entity *)0x0;
  pEStack_268 = (pointer)0x0;
  local_260 = (pointer)0x0;
  pEStack_258 = (pointer)0x0;
  local_250 = &PTR_to_json_abi_cxx11__00262898;
  local_248 = 0xff;
  local_246 = 0xff;
  local_240._0_1_ = false;
  local_240._1_1_ = false;
  local_23e = false;
  Entity::Entity(pEVar39,(Attributes *)local_288);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_268 != (pointer)0x0) {
    operator_delete(pEStack_268,(long)pEStack_258 - (long)pEStack_268);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_1e0.type_id = 0xc0;
  local_1e0.position.x = '\x1e';
  local_1e0.position.y = '\x13';
  local_1e0.position.z = '\x03';
  local_1e0.position.half_x = false;
  local_1e0.position.half_y = false;
  local_1e0.position.half_z = false;
  local_1e0.orientation = '\0';
  local_1e0.palette = '\x01';
  local_1e0.speed = '\0';
  local_1e0.fightable = false;
  local_1e0.liftable = true;
  local_1e0.can_pass_through = false;
  local_1e0.appear_after_player_moved_away = false;
  local_1e0.gravity_immune = false;
  local_1e0.talkable = false;
  local_1e0.behavior_id = 0;
  local_1e0.dialogue = '\0';
  local_1e0.entity_to_use_tiles_from = (Entity *)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_1e0.persistence_flag.byte = 0xff;
  local_1e0.persistence_flag.bit = 0xff;
  local_1e0.flag_unknown_2_3 = false;
  local_1e0.flag_unknown_2_4 = false;
  local_1e0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_1e0);
  Map::add_entity(pMVar41,pEVar39);
  if (local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_188.type_id = 0xed;
  local_188.position.x = '\x15';
  local_188.position.y = '\x14';
  local_188.position.z = '\x03';
  local_188.position.half_x = false;
  local_188.position.half_y = false;
  local_188.position.half_z = false;
  local_188.orientation = '\0';
  local_188.palette = '\x01';
  local_188.speed = '\0';
  local_188.fightable = false;
  local_188.liftable = true;
  local_188.can_pass_through = false;
  local_188.appear_after_player_moved_away = false;
  local_188.gravity_immune = false;
  local_188.talkable = false;
  local_188.behavior_id = 0;
  local_188.dialogue = '\0';
  local_188.entity_to_use_tiles_from = (Entity *)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_188);
  Map::add_entity(pMVar41,pEVar39);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_138.type_id = 0xed;
  local_138.position.x = '\x1e';
  local_138.position.y = '\x14';
  local_138.position.z = '\x03';
  local_138.position.half_x = false;
  local_138.position.half_y = false;
  local_138.position.half_z = false;
  local_138.orientation = '\0';
  local_138.palette = '\x01';
  local_138.speed = '\0';
  local_138.fightable = false;
  local_138.liftable = true;
  local_138.can_pass_through = false;
  local_138.appear_after_player_moved_away = false;
  local_138.gravity_immune = false;
  local_138.talkable = false;
  local_138.behavior_id = 0;
  local_138.dialogue = '\0';
  local_138.entity_to_use_tiles_from = (Entity *)0x0;
  local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_138.persistence_flag.byte = 0xff;
  local_138.persistence_flag.bit = 0xff;
  local_138.flag_unknown_2_3 = false;
  local_138.flag_unknown_2_4 = false;
  local_138.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_138);
  Map::add_entity(pMVar41,pEVar39);
  if (local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_2a0->_room_7 = pMVar41;
  local_2f8._0_2_ = pMVar41->_id;
  local_2f8._6_2_ = local_2a0->_room_6->_id;
  local_2f8.position.y = '\x13';
  local_2f8.position.z = '\x19';
  local_2f8.position.half_x = true;
  local_2f8.palette = '\"';
  local_2f8.speed = '\x19';
  local_2f8.fightable = false;
  iVar42._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar42._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar42,(MapConnection *)&local_2f8);
  }
  else {
    (iVar42._M_current)->_pos_x_2 = (char)0x1922;
    (iVar42._M_current)->_pos_y_2 = (char)(0x1922 >> 8);
    (iVar42._M_current)->_extra_byte_2 = (char)(0x1922 >> 0x10);
    (iVar42._M_current)->field_0xb = local_2f8.liftable;
    (iVar42._M_current)->_map_id_1 = local_2f8._0_2_;
    (iVar42._M_current)->_pos_x_1 = (char)0x1913;
    (iVar42._M_current)->_pos_y_1 = (char)(0x1913 >> 8);
    (iVar42._M_current)->_extra_byte_1 = 4;
    (iVar42._M_current)->field_0x5 = local_2f8.position.half_y;
    (iVar42._M_current)->_map_id_2 = local_2f8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pMVar41 = (Map *)operator_new(0xe0);
  local_2f8.type_id = 0xb5;
  local_2f8.position.x = '\0';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(local_2a8,(key_type *)&local_2f8);
  Map::Map(pMVar41,*ppMVar36);
  Map::clear_entities(pMVar41);
  pMVar41->_id = 0x330;
  pMVar41->_palette = palette;
  pMVar41->_background_music = '\x14';
  pEVar39 = (Entity *)operator_new(0x58);
  local_2f8.type_id = '\x06';
  local_2f8.position.x = '\x15';
  local_2f8.position.y = '\x15';
  local_2f8.position.z = '\x01';
  local_2f8.behavior_id = 0;
  local_2f8.position.half_x = false;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\0';
  local_2f8.palette = '\0';
  local_2f8.speed = '\0';
  local_2f8.fightable = false;
  local_2f8.liftable = false;
  local_2f8.can_pass_through = false;
  local_2f8.appear_after_player_moved_away = false;
  local_2f8.gravity_immune = false;
  local_2f8.talkable = false;
  local_2f8.dialogue = '\0';
  local_2f8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_2f8.persistence_flag.byte = 0xff;
  local_2f8.persistence_flag.bit = 0xff;
  local_2f8.flag_unknown_2_3 = false;
  local_2f8.flag_unknown_2_4 = false;
  local_2f8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_2f8);
  Map::add_entity(pMVar41,pEVar39);
  if (local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_238[0] = '\x06';
  local_238[1] = '\x15';
  local_238[2] = '\x10';
  local_238[3] = '\x01';
  aStack_228._M_allocated_capacity._2_2_ = 0;
  local_238[4] = false;
  local_238[5] = false;
  local_238[6] = false;
  local_238[7] = '\0';
  local_238[8] = '\0';
  local_238[9] = '\0';
  local_238[10] = false;
  local_238[0xb] = false;
  uStack_22c._0_1_ = false;
  uStack_22c._1_1_ = false;
  uStack_22c._2_1_ = false;
  uStack_22c._3_1_ = false;
  aStack_228._M_local_buf[0] = '\0';
  aStack_228._8_8_ = (Entity *)0x0;
  pEStack_218 = (pointer)0x0;
  local_210 = (pointer)0x0;
  pEStack_208 = (pointer)0x0;
  local_200 = &PTR_to_json_abi_cxx11__00262898;
  local_1f8 = 0xff;
  local_1f6 = 0xff;
  local_1f0._0_1_ = false;
  local_1f0._1_1_ = false;
  local_1ee = false;
  Entity::Entity(pEVar39,(Attributes *)local_238);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_218 != (pointer)0x0) {
    operator_delete(pEStack_218,(long)pEStack_208 - (long)pEStack_218);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_288[0] = '\x06';
  local_288[1] = '\x10';
  local_288[2] = '\x10';
  local_288[3] = '\x01';
  aStack_278._M_allocated_capacity._2_2_ = 0;
  local_288[4] = false;
  local_288[5] = false;
  local_288[6] = false;
  local_288[7] = '\0';
  local_288[8] = '\0';
  local_288[9] = '\0';
  local_288[10] = false;
  local_288[0xb] = false;
  bStack_27c = false;
  uStack_27b._0_1_ = false;
  uStack_27b._1_1_ = false;
  bStack_279 = false;
  aStack_278._M_local_buf[0] = '\0';
  aStack_278._8_8_ = (Entity *)0x0;
  pEStack_268 = (pointer)0x0;
  local_260 = (pointer)0x0;
  pEStack_258 = (pointer)0x0;
  local_250 = &PTR_to_json_abi_cxx11__00262898;
  local_248 = 0xff;
  local_246 = 0xff;
  local_240._0_1_ = false;
  local_240._1_1_ = false;
  local_23e = false;
  Entity::Entity(pEVar39,(Attributes *)local_288);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_268 != (pointer)0x0) {
    operator_delete(pEStack_268,(long)pEStack_258 - (long)pEStack_268);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_1e0.type_id = 'g';
  local_1e0.position.x = '\x1a';
  local_1e0.position.y = '\x12';
  local_1e0.position.z = '\x01';
  local_1e0.position.half_x = false;
  local_1e0.position.half_y = false;
  local_1e0.position.half_z = false;
  local_1e0.orientation = '\x01';
  local_1e0.can_pass_through = false;
  local_1e0.palette = '\0';
  local_1e0.speed = '\0';
  local_1e0.fightable = false;
  local_1e0.liftable = false;
  local_1e0.appear_after_player_moved_away = true;
  local_1e0.gravity_immune = false;
  local_1e0.talkable = false;
  local_1e0.dialogue = '\0';
  local_1e0.behavior_id = 0x311;
  local_1e0.entity_to_use_tiles_from = (Entity *)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_1e0.persistence_flag.byte = 0xff;
  local_1e0.persistence_flag.bit = 0xff;
  local_1e0.flag_unknown_2_3 = false;
  local_1e0.flag_unknown_2_4 = false;
  local_1e0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_1e0);
  Map::add_entity(pMVar41,pEVar39);
  if (local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_188.type_id = 'r';
  local_188.position.x = '\x12';
  local_188.position.y = '\x13';
  local_188.position.z = '\0';
  local_188.position.half_x = false;
  local_188.position.half_y = false;
  local_188.position.half_z = true;
  local_188.talkable = false;
  local_188.dialogue = '\0';
  local_188.orientation = '\0';
  local_188.palette = '\0';
  local_188.speed = '\0';
  local_188.fightable = false;
  local_188.liftable = false;
  local_188.can_pass_through = false;
  local_188.appear_after_player_moved_away = false;
  local_188.gravity_immune = false;
  local_188.behavior_id = 0x6a;
  local_188.entity_to_use_tiles_from = (Entity *)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_188);
  Map::add_entity(pMVar41,pEVar39);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_138.type_id = 'r';
  local_138.position.x = '\x13';
  local_138.position.y = '\x13';
  local_138.position.z = '\0';
  local_138.position.half_x = false;
  local_138.position.half_y = false;
  local_138.position.half_z = true;
  local_138.talkable = false;
  local_138.dialogue = '\0';
  local_138.orientation = '\0';
  local_138.palette = '\0';
  local_138.speed = '\0';
  local_138.fightable = false;
  local_138.liftable = false;
  local_138.can_pass_through = false;
  local_138.appear_after_player_moved_away = false;
  local_138.gravity_immune = false;
  local_138.behavior_id = 0x6a;
  local_138.entity_to_use_tiles_from = (Entity *)0x0;
  local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_138.persistence_flag.byte = 0xff;
  local_138.persistence_flag.bit = 0xff;
  local_138.flag_unknown_2_3 = false;
  local_138.flag_unknown_2_4 = false;
  local_138.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_138);
  Map::add_entity(pMVar41,pEVar39);
  if (local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  World::add_map(&pRVar30->super_World,pMVar41);
  local_2a0->_room_8 = pMVar41;
  local_2f8._0_2_ = local_2a0->_room_2->_id;
  local_2f8._6_2_ = pMVar41->_id;
  local_2f8.position.y = '\x13';
  local_2f8.position.z = '\x19';
  local_2f8.position.half_x = true;
  local_2f8.palette = '\x1b';
  local_2f8.speed = '\x12';
  local_2f8.fightable = false;
  iVar42._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar42._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar42,(MapConnection *)&local_2f8);
  }
  else {
    (iVar42._M_current)->_pos_x_2 = (char)0x121b;
    (iVar42._M_current)->_pos_y_2 = (char)(0x121b >> 8);
    (iVar42._M_current)->_extra_byte_2 = (char)(0x121b >> 0x10);
    (iVar42._M_current)->field_0xb = local_2f8.liftable;
    (iVar42._M_current)->_map_id_1 = local_2f8._0_2_;
    (iVar42._M_current)->_pos_x_1 = (char)0x1913;
    (iVar42._M_current)->_pos_y_1 = (char)(0x1913 >> 8);
    (iVar42._M_current)->_extra_byte_1 = 4;
    (iVar42._M_current)->field_0x5 = local_2f8.position.half_y;
    (iVar42._M_current)->_map_id_2 = local_2f8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pmVar1 = local_2a8;
  local_2f8.type_id = 0x95;
  local_2f8.position.x = '\x02';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(local_2a8,(key_type *)&local_2f8);
  pMVar41 = *ppMVar36;
  local_2f8.type_id = 0xaf;
  local_2f8.position.x = '\0';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_layout = (*ppMVar36)->_layout;
  local_2f8.type_id = 0xaf;
  local_2f8.position.x = '\0';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(pmVar1,(key_type *)&local_2f8);
  pMVar41->_blockset = (*ppMVar36)->_blockset;
  pMVar41->_palette = palette;
  pMVar41->_background_music = '\x14';
  pEVar39 = (Entity *)operator_new(0x58);
  local_2f8.type_id = 'h';
  local_2f8.position.x = '\x1f';
  local_2f8.position.y = '\x11';
  local_2f8.position.z = '\a';
  local_2f8.position.half_x = false;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\x02';
  local_2f8.behavior_id = 0;
  local_2f8.dialogue = '\0';
  local_2f8.palette = '\0';
  local_2f8.speed = '\0';
  local_2f8.fightable = false;
  local_2f8.liftable = false;
  local_2f8.can_pass_through = false;
  local_2f8.appear_after_player_moved_away = false;
  local_2f8.gravity_immune = false;
  local_2f8.talkable = false;
  local_2f8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_2f8.persistence_flag.byte = 0xff;
  local_2f8.persistence_flag.bit = 0xff;
  local_2f8.flag_unknown_2_3 = false;
  local_2f8.flag_unknown_2_4 = false;
  local_2f8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_2f8);
  Map::add_entity(pMVar41,pEVar39);
  if (local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_238[0] = 'J';
  local_238[1] = '\x1b';
  local_238[2] = '!';
  local_238[3] = '\x01';
  local_238[4] = false;
  local_238[5] = false;
  local_238[6] = true;
  local_238[7] = '\0';
  local_238[8] = '\0';
  local_238[9] = '\x03';
  local_238[10] = true;
  local_238[0xb] = false;
  uStack_22c._0_1_ = false;
  uStack_22c._1_1_ = false;
  uStack_22c._2_1_ = true;
  uStack_22c._3_1_ = false;
  aStack_228._M_local_buf[0] = '\0';
  aStack_228._M_allocated_capacity._2_2_ = 0x173;
  aStack_228._8_8_ = (Entity *)0x0;
  pEStack_218 = (pointer)0x0;
  local_210 = (pointer)0x0;
  pEStack_208 = (pointer)0x0;
  local_200 = &PTR_to_json_abi_cxx11__00262898;
  local_1f8 = 0xff;
  local_1f6 = 0xff;
  local_1f0._0_1_ = false;
  local_1f0._1_1_ = false;
  local_1ee = false;
  Entity::Entity(pEVar39,(Attributes *)local_238);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_218 != (pointer)0x0) {
    operator_delete(pEStack_218,(long)pEStack_208 - (long)pEStack_218);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_288[0] = 'J';
  local_288[1] = '\x1f';
  local_288[2] = '!';
  local_288[3] = '\x01';
  local_288[4] = false;
  local_288[5] = false;
  local_288[6] = true;
  local_288[7] = '\0';
  local_288[8] = '\0';
  local_288[9] = '\x03';
  local_288[10] = true;
  local_288[0xb] = false;
  bStack_27c = false;
  uStack_27b._0_1_ = false;
  uStack_27b._1_1_ = true;
  bStack_279 = false;
  aStack_278._M_local_buf[0] = '\0';
  aStack_278._M_allocated_capacity._2_2_ = 0x173;
  aStack_278._8_8_ = (Entity *)0x0;
  pEStack_268 = (pointer)0x0;
  local_260 = (pointer)0x0;
  pEStack_258 = (pointer)0x0;
  local_250 = &PTR_to_json_abi_cxx11__00262898;
  local_248 = 0xff;
  local_246 = 0xff;
  local_240._0_1_ = false;
  local_240._1_1_ = false;
  local_23e = false;
  Entity::Entity(pEVar39,(Attributes *)local_288);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_268 != (pointer)0x0) {
    operator_delete(pEStack_268,(long)pEStack_258 - (long)pEStack_268);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_1e0.type_id = 'J';
  local_1e0.position.x = '\x1d';
  local_1e0.position.y = '0';
  local_1e0.position.z = '\x01';
  local_1e0.position.half_x = false;
  local_1e0.position.half_y = false;
  local_1e0.position.half_z = false;
  local_1e0.orientation = '\0';
  local_1e0.palette = '\0';
  local_1e0.speed = '\x03';
  local_1e0.fightable = true;
  local_1e0.liftable = false;
  local_1e0.can_pass_through = false;
  local_1e0.appear_after_player_moved_away = false;
  local_1e0.gravity_immune = true;
  local_1e0.talkable = false;
  local_1e0.dialogue = '\0';
  local_1e0.behavior_id = 0x173;
  local_1e0.entity_to_use_tiles_from = (Entity *)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_1e0.persistence_flag.byte = 0xff;
  local_1e0.persistence_flag.bit = 0xff;
  local_1e0.flag_unknown_2_3 = false;
  local_1e0.flag_unknown_2_4 = false;
  local_1e0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_1e0);
  Map::add_entity(pMVar41,pEVar39);
  if (local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_188.type_id = 'J';
  local_188.position.x = '\x1c';
  local_188.position.y = '3';
  local_188.position.z = '\x02';
  local_188.position.half_x = false;
  local_188.position.half_y = false;
  local_188.position.half_z = false;
  local_188.orientation = '\0';
  local_188.palette = '\0';
  local_188.speed = '\x04';
  local_188.fightable = true;
  local_188.liftable = false;
  local_188.can_pass_through = false;
  local_188.appear_after_player_moved_away = false;
  local_188.gravity_immune = true;
  local_188.talkable = false;
  local_188.dialogue = '\0';
  local_188.behavior_id = 0x4a;
  local_188.entity_to_use_tiles_from = (Entity *)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_188);
  Map::add_entity(pMVar41,pEVar39);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_138.type_id = 'J';
  local_138.position.x = '\x16';
  local_138.position.y = '3';
  local_138.position.z = '\x02';
  local_138.position.half_x = false;
  local_138.position.half_y = false;
  local_138.position.half_z = true;
  local_138.orientation = '\0';
  local_138.palette = '\0';
  local_138.speed = '\x04';
  local_138.fightable = true;
  local_138.liftable = false;
  local_138.can_pass_through = false;
  local_138.appear_after_player_moved_away = false;
  local_138.gravity_immune = true;
  local_138.talkable = false;
  local_138.dialogue = '\0';
  local_138.behavior_id = 0x4a;
  local_138.entity_to_use_tiles_from = (Entity *)0x0;
  local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_138.persistence_flag.byte = 0xff;
  local_138.persistence_flag.bit = 0xff;
  local_138.flag_unknown_2_3 = false;
  local_138.flag_unknown_2_4 = false;
  local_138.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_138);
  Map::add_entity(pMVar41,pEVar39);
  if (local_138.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_d0.type_id = 'J';
  local_d0.position.x = '\x10';
  local_d0.position.y = '3';
  local_d0.position.z = '\x02';
  local_d0.position.half_x = false;
  local_d0.position.half_y = false;
  local_d0.position.half_z = false;
  local_d0.orientation = '\0';
  local_d0.palette = '\0';
  local_d0.speed = '\x04';
  local_d0.fightable = true;
  local_d0.liftable = false;
  local_d0.can_pass_through = false;
  local_d0.appear_after_player_moved_away = false;
  local_d0.gravity_immune = true;
  local_d0.talkable = false;
  local_d0.dialogue = '\0';
  local_d0.behavior_id = 0x4a;
  local_d0.entity_to_use_tiles_from = (Entity *)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_d0.persistence_flag.byte = 0xff;
  local_d0.persistence_flag.bit = 0xff;
  local_d0.flag_unknown_2_3 = false;
  local_d0.flag_unknown_2_4 = false;
  local_d0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_d0);
  Map::add_entity(pMVar41,pEVar39);
  if (local_d0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_80.type_id = 'J';
  local_80.position.x = '\x1f';
  local_80.position.y = '%';
  local_80.position.z = '\x02';
  local_80.position.half_x = false;
  local_80.position.half_y = false;
  local_80.position.half_z = false;
  local_80.orientation = '\0';
  local_80.palette = '\0';
  local_80.speed = '\x04';
  local_80.fightable = true;
  local_80.liftable = false;
  local_80.can_pass_through = false;
  local_80.appear_after_player_moved_away = false;
  local_80.gravity_immune = true;
  local_80.talkable = false;
  local_80.dialogue = '\0';
  local_80.behavior_id = 0x4a;
  local_80.entity_to_use_tiles_from = (Entity *)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_80.persistence_flag.byte = 0xff;
  local_80.persistence_flag.bit = 0xff;
  local_80.flag_unknown_2_3 = false;
  local_80.flag_unknown_2_4 = false;
  local_80.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_80);
  Map::add_entity(pMVar41,pEVar39);
  pRVar30 = local_290;
  if (local_80.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pMVar37 = local_d8;
  local_2a0->_room_9 = pMVar41;
  local_2f8._0_2_ = pMVar41->_id;
  local_2f8._6_2_ = local_2a0->_room_8->_id;
  local_2f8.position.y = '\x1f';
  local_2f8.position.z = '\x12';
  local_2f8.position.half_x = true;
  local_2f8.palette = '\x12';
  local_2f8.speed = '\x13';
  local_2f8.fightable = false;
  iVar42._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar42._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar42,(MapConnection *)&local_2f8);
  }
  else {
    (iVar42._M_current)->_pos_x_2 = (char)0x1312;
    (iVar42._M_current)->_pos_y_2 = (char)(0x1312 >> 8);
    (iVar42._M_current)->_extra_byte_2 = (char)(0x1312 >> 0x10);
    (iVar42._M_current)->field_0xb = local_2f8.liftable;
    (iVar42._M_current)->_map_id_1 = local_2f8._0_2_;
    (iVar42._M_current)->_pos_x_1 = (char)0x121f;
    (iVar42._M_current)->_pos_y_1 = (char)(0x121f >> 8);
    (iVar42._M_current)->_extra_byte_1 = 10;
    (iVar42._M_current)->field_0x5 = local_2f8.position.half_y;
    (iVar42._M_current)->_map_id_2 = local_2f8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pMVar38 = local_190;
  pMVar41 = add_gh_stairs_room(pRVar30,palette,0x331);
  this_00 = local_298;
  local_2a0->_room_10 = pMVar41;
  local_2f8._0_2_ = local_2a0->_room_9->_id;
  local_2f8._6_2_ = pMVar41->_id;
  local_2f8.position.y = '\x10';
  local_2f8.position.z = '3';
  local_2f8.position.half_x = true;
  local_2f8.palette = '-';
  local_2f8.speed = '\x16';
  local_2f8.fightable = false;
  iVar42._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar42._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (local_298,iVar42,(MapConnection *)&local_2f8);
  }
  else {
    (iVar42._M_current)->_pos_x_2 = (char)0x162d;
    (iVar42._M_current)->_pos_y_2 = (char)(0x162d >> 8);
    (iVar42._M_current)->_extra_byte_2 = (char)(0x162d >> 0x10);
    (iVar42._M_current)->field_0xb = local_2f8.liftable;
    (iVar42._M_current)->_map_id_1 = local_2f8._0_2_;
    (iVar42._M_current)->_pos_x_1 = (char)0x3310;
    (iVar42._M_current)->_pos_y_1 = (char)(0x3310 >> 8);
    (iVar42._M_current)->_extra_byte_1 = 4;
    (iVar42._M_current)->field_0x5 = local_2f8.position.half_y;
    (iVar42._M_current)->_map_id_2 = local_2f8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pMVar41 = add_gh_stairs_room(pRVar30,pMVar37,0x332);
  local_2a0->_room_11 = pMVar41;
  local_2f8._0_2_ = local_2a0->_room_10->_id;
  local_2f8._6_2_ = pMVar41->_id;
  local_2f8.position.y = '\x14';
  local_2f8.position.z = '\x16';
  local_2f8.position.half_x = true;
  local_2f8.palette = '-';
  local_2f8.speed = '\x16';
  local_2f8.fightable = false;
  iVar42._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar42._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (this_00,iVar42,(MapConnection *)&local_2f8);
  }
  else {
    (iVar42._M_current)->_pos_x_2 = (char)0x162d;
    (iVar42._M_current)->_pos_y_2 = (char)(0x162d >> 8);
    (iVar42._M_current)->_extra_byte_2 = (char)(0x162d >> 0x10);
    (iVar42._M_current)->field_0xb = local_2f8.liftable;
    (iVar42._M_current)->_map_id_1 = local_2f8._0_2_;
    (iVar42._M_current)->_pos_x_1 = (char)0x1614;
    (iVar42._M_current)->_pos_y_1 = (char)(0x1614 >> 8);
    (iVar42._M_current)->_extra_byte_1 = 4;
    (iVar42._M_current)->field_0x5 = local_2f8.position.half_y;
    (iVar42._M_current)->_map_id_2 = local_2f8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pMVar41 = add_gh_stairs_room(pRVar30,pMVar38,0x333);
  local_2a0->_room_12 = pMVar41;
  local_2f8._0_2_ = local_2a0->_room_11->_id;
  local_2f8._6_2_ = pMVar41->_id;
  local_2f8.position.y = '\x14';
  local_2f8.position.z = '\x16';
  local_2f8.position.half_x = true;
  local_2f8.palette = '-';
  local_2f8.speed = '\x16';
  local_2f8.fightable = false;
  iVar42._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar42._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (this_00,iVar42,(MapConnection *)&local_2f8);
  }
  else {
    (iVar42._M_current)->_pos_x_2 = (char)0x162d;
    (iVar42._M_current)->_pos_y_2 = (char)(0x162d >> 8);
    (iVar42._M_current)->_extra_byte_2 = (char)(0x162d >> 0x10);
    (iVar42._M_current)->field_0xb = local_2f8.liftable;
    (iVar42._M_current)->_map_id_1 = local_2f8._0_2_;
    (iVar42._M_current)->_pos_x_1 = (char)0x1614;
    (iVar42._M_current)->_pos_y_1 = (char)(0x1614 >> 8);
    (iVar42._M_current)->_extra_byte_1 = 4;
    (iVar42._M_current)->field_0x5 = local_2f8.position.half_y;
    (iVar42._M_current)->_map_id_2 = local_2f8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pMVar41 = (Map *)operator_new(0xe0);
  local_2f8.type_id = '@';
  local_2f8.position.x = '\x01';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(local_2a8,(key_type *)&local_2f8);
  Map::Map(pMVar41,*ppMVar36);
  Map::clear_entities(pMVar41);
  pMVar41->_id = 0x334;
  pMVar41->_palette = pMVar38;
  pMVar41->_background_music = '\x12';
  pEVar39 = (Entity *)operator_new(0x58);
  local_2f8.type_id = 'h';
  local_2f8.position.x = '\x11';
  local_2f8.position.y = '\x19';
  local_2f8.position.z = '\x02';
  local_2f8.position.half_x = false;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\x01';
  local_2f8.behavior_id = 0;
  local_2f8.dialogue = '\0';
  local_2f8.palette = '\0';
  local_2f8.speed = '\0';
  local_2f8.fightable = false;
  local_2f8.liftable = false;
  local_2f8.can_pass_through = false;
  local_2f8.appear_after_player_moved_away = false;
  local_2f8.gravity_immune = false;
  local_2f8.talkable = false;
  local_2f8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_2f8.persistence_flag.byte = 0xff;
  local_2f8.persistence_flag.bit = 0xff;
  local_2f8.flag_unknown_2_3 = false;
  local_2f8.flag_unknown_2_4 = false;
  local_2f8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_2f8);
  Map::add_entity(pMVar41,pEVar39);
  if (local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_238[0] = 'h';
  local_238[1] = '\x19';
  local_238[2] = '\x11';
  local_238[3] = '\x02';
  aStack_228._M_allocated_capacity._2_2_ = 0;
  local_238[4] = false;
  local_238[5] = false;
  local_238[6] = false;
  local_238[7] = '\0';
  local_238[8] = '\0';
  local_238[9] = '\0';
  local_238[10] = false;
  local_238[0xb] = false;
  uStack_22c._0_1_ = false;
  uStack_22c._1_1_ = false;
  uStack_22c._2_1_ = false;
  uStack_22c._3_1_ = false;
  aStack_228._M_local_buf[0] = '\0';
  aStack_228._8_8_ = (Entity *)0x0;
  pEStack_218 = (pointer)0x0;
  local_210 = (pointer)0x0;
  pEStack_208 = (pointer)0x0;
  local_200 = &PTR_to_json_abi_cxx11__00262898;
  local_1f8 = 0xff;
  local_1f6 = 0xff;
  local_1f0._0_1_ = false;
  local_1f0._1_1_ = false;
  local_1ee = false;
  Entity::Entity(pEVar39,(Attributes *)local_238);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_218 != (pointer)0x0) {
    operator_delete(pEStack_218,(long)pEStack_208 - (long)pEStack_218);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_288[0] = '\\';
  local_288[1] = '\x19';
  local_288[2] = '\x19';
  local_288[3] = '\0';
  local_288[4] = false;
  local_288[5] = false;
  local_288[6] = true;
  bStack_279 = false;
  aStack_278._M_local_buf[0] = '\0';
  local_288[7] = '\0';
  local_288[8] = '\0';
  local_288[9] = '\0';
  local_288[10] = false;
  local_288[0xb] = false;
  bStack_27c = false;
  uStack_27b._0_1_ = false;
  uStack_27b._1_1_ = false;
  aStack_278._M_allocated_capacity._2_2_ = 0x46;
  aStack_278._8_8_ = (Entity *)0x0;
  pEStack_268 = (pointer)0x0;
  local_260 = (pointer)0x0;
  pEStack_258 = (pointer)0x0;
  local_250 = &PTR_to_json_abi_cxx11__00262898;
  local_248 = 0xff;
  local_246 = 0xff;
  local_240._0_1_ = false;
  local_240._1_1_ = false;
  local_23e = false;
  Entity::Entity(pEVar39,(Attributes *)local_288);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_268 != (pointer)0x0) {
    operator_delete(pEStack_268,(long)pEStack_258 - (long)pEStack_268);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_1e0.type_id = 'd';
  local_1e0.position.x = '\x16';
  local_1e0.position.y = '\x19';
  local_1e0.position.z = '\x02';
  local_1e0.position.half_x = false;
  local_1e0.position.half_y = true;
  local_1e0.position.half_z = false;
  local_1e0.orientation = '\x01';
  local_1e0.behavior_id = 0;
  local_1e0.dialogue = '\0';
  local_1e0.palette = '\0';
  local_1e0.speed = '\0';
  local_1e0.fightable = false;
  local_1e0.liftable = false;
  local_1e0.can_pass_through = false;
  local_1e0.appear_after_player_moved_away = false;
  local_1e0.gravity_immune = false;
  local_1e0.talkable = false;
  local_1e0.entity_to_use_tiles_from = (Entity *)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_1e0.persistence_flag.byte = 0xff;
  local_1e0.persistence_flag.bit = 0xff;
  local_1e0.flag_unknown_2_3 = false;
  local_1e0.flag_unknown_2_4 = false;
  local_1e0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_1e0);
  Map::add_entity(pMVar41,pEVar39);
  if (local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  World::add_map(&pRVar30->super_World,pMVar41);
  local_2a0->_room_13 = pMVar41;
  local_2f8._0_2_ = local_2a0->_room_12->_id;
  local_2f8._6_2_ = pMVar41->_id;
  local_2f8.position.y = '\x14';
  local_2f8.position.z = '\x16';
  local_2f8.position.half_x = true;
  local_2f8.palette = '\"';
  local_2f8.speed = '\x19';
  local_2f8.fightable = false;
  iVar42._M_current =
       (pRVar30->super_World)._map_connections.
       super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar42._M_current ==
      (pRVar30->super_World)._map_connections.
      super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<MapConnection,_std::allocator<MapConnection>_>::_M_realloc_insert<MapConnection>
              (this_00,iVar42,(MapConnection *)&local_2f8);
  }
  else {
    (iVar42._M_current)->_pos_x_2 = (char)0x1922;
    (iVar42._M_current)->_pos_y_2 = (char)(0x1922 >> 8);
    (iVar42._M_current)->_extra_byte_2 = (char)(0x1922 >> 0x10);
    (iVar42._M_current)->field_0xb = local_2f8.liftable;
    (iVar42._M_current)->_map_id_1 = local_2f8._0_2_;
    (iVar42._M_current)->_pos_x_1 = (char)0x1614;
    (iVar42._M_current)->_pos_y_1 = (char)(0x1614 >> 8);
    (iVar42._M_current)->_extra_byte_1 = 4;
    (iVar42._M_current)->field_0x5 = local_2f8.position.half_y;
    (iVar42._M_current)->_map_id_2 = local_2f8._6_2_;
    ppMVar2 = &(pRVar30->super_World)._map_connections.
               super__Vector_base<MapConnection,_std::allocator<MapConnection>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppMVar2 = *ppMVar2 + 1;
  }
  pMVar41 = (Map *)operator_new(0xe0);
  local_2f8.type_id = 'o';
  local_2f8.position.x = '\0';
  ppMVar36 = std::
             map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
             ::at(local_2a8,(key_type *)&local_2f8);
  Map::Map(pMVar41,*ppMVar36);
  Map::clear_entities(pMVar41);
  pMVar41->_id = 0x335;
  pMVar41->_palette = local_e0;
  pMVar41->_background_music = '\x15';
  pEVar39 = (Entity *)operator_new(0x58);
  local_2f8.type_id = 0xa5;
  local_2f8.position.x = '\x1d';
  local_2f8.position.y = '\x16';
  local_2f8.position.z = '\x04';
  local_2f8.position.half_x = false;
  local_2f8.position.half_y = false;
  local_2f8.position.half_z = false;
  local_2f8.orientation = '\x02';
  local_2f8.palette = '\x01';
  local_2f8.behavior_id = 0;
  local_2f8.speed = '\0';
  local_2f8.fightable = false;
  local_2f8.liftable = false;
  local_2f8.can_pass_through = false;
  local_2f8.appear_after_player_moved_away = false;
  local_2f8.gravity_immune = false;
  local_2f8.talkable = false;
  local_2f8.dialogue = '\0';
  local_2f8.entity_to_use_tiles_from = (Entity *)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_2f8.persistence_flag.byte = 0xff;
  local_2f8.persistence_flag.bit = 0xff;
  local_2f8.flag_unknown_2_3 = false;
  local_2f8.flag_unknown_2_4 = false;
  local_2f8.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_2f8);
  Map::add_entity(pMVar41,pEVar39);
  if (local_2f8.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_238[0] = 'I';
  local_238[1] = '\x1a';
  local_238[2] = '\x1e';
  local_238[3] = '\x04';
  local_238[4] = false;
  local_238[5] = false;
  local_238[6] = false;
  local_238[7] = '\0';
  local_238[8] = '\x01';
  local_238[9] = '\x04';
  local_238[10] = true;
  local_238[0xb] = false;
  uStack_22c._0_1_ = false;
  uStack_22c._1_1_ = false;
  uStack_22c._2_1_ = true;
  uStack_22c._3_1_ = false;
  aStack_228._M_local_buf[0] = '\0';
  aStack_228._M_allocated_capacity._2_2_ = 0x173;
  aStack_228._8_8_ = (Entity *)0x0;
  pEStack_218 = (pointer)0x0;
  local_210 = (pointer)0x0;
  pEStack_208 = (pointer)0x0;
  local_200 = &PTR_to_json_abi_cxx11__00262898;
  local_1f8 = 0xff;
  local_1f6 = 0xff;
  local_1f0._0_1_ = false;
  local_1f0._1_1_ = false;
  local_1ee = false;
  Entity::Entity(pEVar39,(Attributes *)local_238);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_218 != (pointer)0x0) {
    operator_delete(pEStack_218,(long)pEStack_208 - (long)pEStack_218);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_288[0] = 'Q';
  local_288[1] = '\x1d';
  local_288[2] = '\"';
  local_288[3] = '\x05';
  local_288[4] = false;
  local_288[5] = false;
  local_288[6] = true;
  local_288[7] = '\0';
  aStack_278._M_allocated_capacity._2_2_ = 0;
  local_288[8] = '\x01';
  local_288[9] = '\0';
  local_288[10] = false;
  local_288[0xb] = false;
  bStack_27c = false;
  uStack_27b._0_1_ = false;
  uStack_27b._1_1_ = false;
  bStack_279 = false;
  aStack_278._M_local_buf[0] = '\0';
  aStack_278._8_8_ = (Entity *)0x0;
  pEStack_268 = (pointer)0x0;
  local_260 = (pointer)0x0;
  pEStack_258 = (pointer)0x0;
  local_250 = &PTR_to_json_abi_cxx11__00262898;
  local_248 = 0xff;
  local_246 = 0xff;
  local_240._0_1_ = false;
  local_240._1_1_ = false;
  local_23e = false;
  Entity::Entity(pEVar39,(Attributes *)local_288);
  Map::add_entity(pMVar41,pEVar39);
  if (pEStack_268 != (pointer)0x0) {
    operator_delete(pEStack_268,(long)pEStack_258 - (long)pEStack_268);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_1e0.type_id = 'Q';
  local_1e0.position.x = '\x1e';
  local_1e0.position.y = '\"';
  local_1e0.position.z = '\x05';
  local_1e0.position.half_x = false;
  local_1e0.position.half_y = false;
  local_1e0.position.half_z = true;
  local_1e0.orientation = '\0';
  local_1e0.behavior_id = 0;
  local_1e0.palette = '\x01';
  local_1e0.speed = '\0';
  local_1e0.fightable = false;
  local_1e0.liftable = false;
  local_1e0.can_pass_through = false;
  local_1e0.appear_after_player_moved_away = false;
  local_1e0.gravity_immune = false;
  local_1e0.talkable = false;
  local_1e0.dialogue = '\0';
  local_1e0.entity_to_use_tiles_from = (Entity *)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_1e0.persistence_flag.byte = 0xff;
  local_1e0.persistence_flag.bit = 0xff;
  local_1e0.flag_unknown_2_3 = false;
  local_1e0.flag_unknown_2_4 = false;
  local_1e0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_1e0);
  Map::add_entity(pMVar41,pEVar39);
  if (local_1e0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pEVar39 = (Entity *)operator_new(0x58);
  local_188.type_id = 'Q';
  local_188.position.x = '\x1f';
  local_188.position.y = '\"';
  local_188.position.z = '\x05';
  local_188.position.half_x = false;
  local_188.position.half_y = false;
  local_188.position.half_z = true;
  local_188.orientation = '\0';
  local_188.palette = '\x01';
  local_188.behavior_id = 0;
  local_188.speed = '\0';
  local_188.fightable = false;
  local_188.liftable = false;
  local_188.can_pass_through = false;
  local_188.appear_after_player_moved_away = false;
  local_188.gravity_immune = false;
  local_188.talkable = false;
  local_188.dialogue = '\0';
  local_188.entity_to_use_tiles_from = (Entity *)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00262898;
  local_188.persistence_flag.byte = 0xff;
  local_188.persistence_flag.bit = 0xff;
  local_188.flag_unknown_2_3 = false;
  local_188.flag_unknown_2_4 = false;
  local_188.flag_unknown_3_5 = false;
  Entity::Entity(pEVar39,&local_188);
  Map::add_entity(pMVar41,pEVar39);
  if (local_188.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  World::add_map(&pRVar30->super_World,pMVar41);
  local_2a0->_room_14 = pMVar41;
  local_2a0->_room_13->_fall_destination = pMVar41->_id;
  return;
}

Assistant:

void PatchAddGolasHeart::alter_world(World& w)
{
    RandomizerWorld& world = reinterpret_cast<RandomizerWorld&>(w);

    MapPalette* golas_heart_palette = build_golas_heart_palette(world);
    MapPalette* stairs_palette_2 = build_greyscale_palette(world, world.map(MAP_LAKE_SHRINE_342)->palette());
    MapPalette* stairs_palette_1 = build_transition_palette(world, golas_heart_palette, stairs_palette_2);
    MapPalette* final_fight_palette = build_greyscale_palette(world, world.map(MAP_NOLE_ARENA)->palette(), 0.4);

    _room_1 = add_gh_room_1(world);

    // Archway
    _room_2 = add_gh_room_2(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_1->id(), 33, 48, _room_2->id(), 25, 34, 2));

    // Double red spinner room
    _room_3 = add_gh_room_3(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_2->id(), 25, 23, _room_3->id(), 25, 34, 2));

    // Lizards room
    _room_4 = add_gh_room_4(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_3->id(), 25, 19, _room_4->id(), 25, 34, 2));

    // Solo unicorn room
    _room_5 = add_gh_room_5(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_5->id(), 19, 25, _room_4->id(), 34, 25, 4));

    // Mirrors T-room
    _room_6 = add_gh_room_6(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_6->id(), 25, 19, _room_5->id(), 25, 34, 2));
    world.map_connections().emplace_back(MapConnection(_room_6->id(), 19, 25, _room_2->id(), 34, 25, 4));

    // Healing room
    _room_7 = add_gh_room_7(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_7->id(), 19, 25, _room_6->id(), 34, 25, 4));

    // WS orc arena
    _room_8 = add_gh_room_8(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_2->id(), 19, 25, _room_8->id(), 27, 18, 4));

    // WS underground
    _room_9 = add_gh_room_9(world, golas_heart_palette);
    world.map_connections().emplace_back(MapConnection(_room_9->id(), 31, 18, _room_8->id(), 18, 19, 10));

    // Giant stairs
    _room_10 = add_gh_stairs_room(world, golas_heart_palette, MAP_GOLAS_HEART_STAIRS_1);
    world.map_connections().emplace_back(MapConnection(_room_9->id(), 16, 51, _room_10->id(), 45, 22, 4));
    _room_11 = add_gh_stairs_room(world, stairs_palette_1, MAP_GOLAS_HEART_STAIRS_2);
    world.map_connections().emplace_back(MapConnection(_room_10->id(), 20, 22, _room_11->id(), 45, 22, 4));
    _room_12 = add_gh_stairs_room(world, stairs_palette_2, MAP_GOLAS_HEART_STAIRS_3);
    world.map_connections().emplace_back(MapConnection(_room_11->id(), 20, 22, _room_12->id(), 45, 22, 4));

    // Falling room
    _room_13 = add_gh_falling_room(world, stairs_palette_2);
    world.map_connections().emplace_back(MapConnection(_room_12->id(), 20, 22, _room_13->id(), 34, 25, 4));

    // Dark Nole room
    _room_14 = add_gh_final_fight_room(world, final_fight_palette);
    _room_13->fall_destination(_room_14->id());
}